

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::InnerProduct_x86_fma::forward
          (InnerProduct_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined8 uVar12;
  undefined4 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  int *piVar18;
  void *pvVar19;
  undefined4 *puVar20;
  void *pvVar21;
  float *pfVar22;
  uint uVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  int iVar30;
  int iVar31;
  undefined1 (*pauVar32) [32];
  uint uVar33;
  undefined1 (*pauVar34) [32];
  uint uVar35;
  ulong uVar36;
  long lVar37;
  void *pvVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  undefined1 (*pauVar44) [32];
  long lVar45;
  uint uVar46;
  uint uVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  uint uVar51;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar71;
  undefined1 auVar65 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [28];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  float fVar108;
  undefined1 auVar106 [64];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar141 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar120 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [64];
  float fVar163;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [64];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar196 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar205 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [64];
  v4sf one;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [32];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar245 [32];
  undefined1 auVar239 [16];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [64];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [32];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [64];
  float fVar302;
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  float fVar322;
  float fVar324;
  float fVar325;
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  float fVar323;
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [64];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 in_ZMM12 [64];
  undefined1 auVar350 [64];
  undefined1 auVar351 [16];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar357 [16];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [64];
  Option opt_flatten;
  uint local_170;
  undefined1 (*local_138) [32];
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 local_128;
  undefined4 uStack_124;
  int local_120;
  Allocator *local_118;
  int local_110;
  int iStack_10c;
  undefined8 uStack_108;
  int iStack_100;
  size_t local_f8;
  undefined1 local_e8 [16];
  ulong local_d8;
  InnerProduct_x86_fma *local_d0;
  Mat *local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined1 auStack_68 [16];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 auVar376 [12];
  undefined1 auVar68 [32];
  float fVar72;
  undefined1 auVar93 [32];
  float fVar107;
  undefined1 auVar140 [32];
  undefined1 auVar142 [32];
  
  auVar110 = in_ZMM12._0_16_;
  if ((opt->use_int8_inference == true) && ((this->super_InnerProduct).int8_scale_term != 0)) {
    iVar30 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar30;
  }
  iVar30 = cpu_support_x86_f16c();
  if ((iVar30 != 0) && (opt->use_fp16_storage == true)) {
    iVar30 = forward_fp16s(this,bottom_blob,top_blob,opt);
    return iVar30;
  }
  local_110 = bottom_blob->dims;
  if ((local_110 == 2) &&
     (iVar30 = (this->super_InnerProduct).num_output,
     bottom_blob->w == (this->super_InnerProduct).weight_data_size / iVar30)) {
    Mat::create(top_blob,iVar30,bottom_blob->h,bottom_blob->elemsize,bottom_blob->elempack,
                opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    innerproduct_gemm_sse
              (bottom_blob,top_blob,&this->weight_data_tm,&(this->super_InnerProduct).bias_data,
               (this->super_InnerProduct).activation_type,
               &(this->super_InnerProduct).activation_params,opt);
    return 0;
  }
  piVar18 = bottom_blob->refcount;
  local_138 = (undefined1 (*) [32])bottom_blob->data;
  uStack_130 = SUB84(bottom_blob->refcount,0);
  uStack_12c = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_128 = (undefined4)bottom_blob->elemsize;
  uStack_124 = (undefined4)(bottom_blob->elemsize >> 0x20);
  local_120 = bottom_blob->elempack;
  local_118 = bottom_blob->allocator;
  uVar8 = bottom_blob->w;
  uVar9 = bottom_blob->h;
  uVar10 = bottom_blob->d;
  uVar11 = bottom_blob->c;
  auVar376._8_4_ = uVar11;
  auVar376._4_4_ = uVar10;
  auVar376._0_4_ = uVar9;
  uStack_108 = auVar376._0_8_;
  local_f8 = bottom_blob->cstep;
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + 1;
    UNLOCK();
  }
  iStack_10c = uVar8;
  iStack_100 = uVar11;
  if (bottom_blob->dims != 1) {
    auVar244[0] = opt->lightmode;
    auVar244[1] = opt->use_shader_pack8;
    auVar244[2] = opt->use_subgroup_ops;
    auVar244[3] = opt->use_reserved_0;
    auVar244._4_4_ = opt->num_threads;
    auVar244._8_8_ = opt->blob_allocator;
    uVar12 = opt->workspace_allocator;
    uVar13 = opt->openmp_blocktime;
    uVar14 = opt->use_winograd_convolution;
    uVar15 = opt->use_sgemm_convolution;
    uVar16 = opt->use_int8_inference;
    uVar17 = opt->use_vulkan_compute;
    auVar244[0x1f] = uVar17;
    auVar244[0x1e] = uVar16;
    auVar244[0x1d] = uVar15;
    auVar244[0x1c] = uVar14;
    auVar244._24_4_ = uVar13;
    auVar244._16_8_ = uVar12;
    local_58._0_1_ = opt->use_bf16_storage;
    local_58._1_1_ = opt->use_fp16_packed;
    local_58._2_1_ = opt->use_fp16_storage;
    local_58._3_1_ = opt->use_fp16_arithmetic;
    local_58._4_1_ = opt->use_int8_packed;
    local_58._5_1_ = opt->use_int8_storage;
    local_58._6_1_ = opt->use_int8_arithmetic;
    local_58._7_1_ = opt->use_packing_layout;
    uStack_50._0_4_ = opt->vulkan_device_index;
    uStack_50._4_1_ = opt->use_reserved_1;
    uStack_50._5_1_ = opt->use_image_storage;
    uStack_50._6_1_ = opt->use_tensor_storage;
    uStack_50._7_1_ = opt->use_reserved_2;
    uStack_48._0_4_ = opt->flush_denormals;
    uStack_48._4_1_ = opt->use_local_pool_allocator;
    uStack_48._5_1_ = opt->use_shader_local_memory;
    uStack_48._6_1_ = opt->use_cooperative_matrix;
    uStack_48._7_1_ = opt->use_winograd23_convolution;
    uStack_40._0_1_ = opt->use_winograd43_convolution;
    uStack_40._1_1_ = opt->use_winograd63_convolution;
    uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
    uStack_40._3_1_ = opt->use_fp16_uniform;
    uStack_40._4_1_ = opt->use_int8_uniform;
    uStack_40._5_1_ = opt->use_reserved_9;
    uStack_40._6_1_ = opt->use_reserved_10;
    uStack_40._7_1_ = opt->use_reserved_11;
    local_78 = auVar244._0_8_;
    pAStack_70 = opt->workspace_allocator;
    auStack_68 = auVar244._16_16_;
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,&local_138);
    if ((local_138 == (undefined1 (*) [32])0x0) || ((long)iStack_100 * local_f8 == 0)) {
      iVar30 = -100;
      goto LAB_002fd619;
    }
  }
  uVar33 = 1;
  if (opt->use_packing_layout == true) {
    uVar35 = (this->super_InnerProduct).num_output;
    uVar33 = 8;
    if ((uVar35 & 7) != 0) {
      uVar33 = (uint)((uVar35 & 3) == 0) * 3 + 1;
    }
  }
  Mat::create(top_blob,(this->super_InnerProduct).num_output / (int)uVar33,
              (ulong)uVar33 * (CONCAT44(uStack_124,local_128) / (ulong)(long)local_120),uVar33,
              opt->blob_allocator);
  pauVar44 = local_138;
  iVar30 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    uVar33 = (this->super_InnerProduct).activation_type;
    uVar51 = local_120 * iStack_10c;
    iVar30 = top_blob->elempack;
    uVar35 = top_blob->w;
    pvVar19 = (this->super_InnerProduct).bias_data.data;
    if (iVar30 == 1) {
      local_d8 = (ulong)(int)uVar35;
      lVar45 = (long)(int)uVar51;
      if (0 < (int)uVar35 >> 3) {
        local_90 = (ulong)(uint)((int)uVar35 >> 3);
        lVar37 = lVar45 * 0x1c;
        local_98 = lVar45 * 0x20;
        lVar49 = lVar45 * 8;
        lVar41 = lVar45 * 0x18;
        lVar40 = lVar45 * 4;
        local_b8 = lVar45 * 0xc;
        local_c0 = 0;
        auVar250 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar106 = ZEXT1664(ZEXT816(0) << 0x40);
        uVar36 = 0;
        lVar48 = lVar45 * 0x14;
        lVar50 = lVar45 << 4;
        do {
          local_b0 = lVar50;
          local_a8 = lVar48;
          local_80 = uVar36 * 8;
          auVar162 = ZEXT1664(ZEXT816(0) << 0x40);
          if (pvVar19 != (void *)0x0) {
            auVar162 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar19 + uVar36 * 0x20));
          }
          auVar244 = auVar162._0_32_;
          pvVar38 = (this->weight_data_tm).data;
          local_e8._0_8_ = lVar41;
          if ((int)uVar51 < 8) {
            uVar47 = 0;
            lVar48 = local_80 * lVar45 * 4;
            lVar50 = (local_80 | 1) * lVar45 * 4;
            lVar1 = (local_80 | 2) * lVar45 * 4;
            lVar2 = (local_80 | 3) * lVar45 * 4;
            lVar3 = (local_80 | 4) * lVar45 * 4;
            lVar4 = (local_80 | 5) * lVar45 * 4;
            lVar5 = (local_80 | 6) * lVar45 * 4;
            lVar6 = (local_80 | 7) * lVar45 * 4;
            auVar366 = SUB6432(ZEXT864(0),0);
            auVar59 = ZEXT816(0);
            auVar98 = SUB6432(ZEXT864(0),0);
            auVar201 = ZEXT816(0);
            auVar67 = SUB6432(ZEXT864(0),0);
            auVar96 = SUB6432(ZEXT864(0),0);
            auVar161 = SUB6432(ZEXT864(0),0);
            auVar164 = ZEXT816(0);
            pauVar32 = local_138;
            local_a0 = lVar37;
          }
          else {
            auVar164 = ZEXT816(0);
            iVar30 = 7;
            auVar301 = ZEXT864(0);
            auVar238 = ZEXT864(0);
            auVar375 = ZEXT864(0);
            auVar201 = ZEXT816(0);
            auVar195 = ZEXT864(0);
            auVar59 = ZEXT816(0);
            auVar343 = ZEXT864(0);
            lVar48 = 0;
            do {
              lVar39 = lVar48;
              auVar366 = *(undefined1 (*) [32])(*local_138 + lVar39);
              auVar164 = vfmadd231ps_fma(ZEXT1632(auVar164),auVar366,
                                         *(undefined1 (*) [32])((long)pvVar38 + lVar39 + local_c0));
              auVar110 = vfmadd231ps_fma(auVar301._0_32_,auVar366,
                                         *(undefined1 (*) [32])((long)pvVar38 + lVar39 + lVar40));
              auVar301 = ZEXT1664(auVar110);
              auVar161 = ZEXT1632(auVar110);
              auVar110 = vfmadd231ps_fma(auVar238._0_32_,auVar366,
                                         *(undefined1 (*) [32])((long)pvVar38 + lVar39 + lVar49));
              auVar238 = ZEXT1664(auVar110);
              auVar96 = ZEXT1632(auVar110);
              auVar110 = vfmadd231ps_fma(auVar375._0_32_,auVar366,
                                         *(undefined1 (*) [32])((long)pvVar38 + lVar39 + local_b8));
              auVar375 = ZEXT1664(auVar110);
              auVar67 = ZEXT1632(auVar110);
              auVar201 = vfmadd231ps_fma(ZEXT1632(auVar201),auVar366,
                                         *(undefined1 (*) [32])((long)pvVar38 + lVar39 + local_b0));
              auVar110 = vfmadd231ps_fma(auVar195._0_32_,auVar366,
                                         *(undefined1 (*) [32])((long)pvVar38 + lVar39 + local_a8));
              auVar195 = ZEXT1664(auVar110);
              auVar98 = ZEXT1632(auVar110);
              auVar59 = vfmadd231ps_fma(ZEXT1632(auVar59),auVar366,
                                        *(undefined1 (*) [32])((long)pvVar38 + lVar39 + lVar41));
              auVar110 = vfmadd231ps_fma(auVar343._0_32_,auVar366,
                                         *(undefined1 (*) [32])((long)pvVar38 + lVar39 + lVar37));
              auVar343 = ZEXT1664(auVar110);
              auVar366 = ZEXT1632(auVar110);
              iVar30 = iVar30 + 8;
              lVar48 = lVar39 + 0x20;
            } while (iVar30 < (int)uVar51);
            lVar6 = lVar48 + lVar37;
            lVar5 = lVar48 + lVar41;
            lVar4 = lVar48 + local_a8;
            lVar3 = lVar48 + local_b0;
            lVar2 = lVar48 + local_b8;
            lVar1 = lVar48 + lVar49;
            lVar50 = lVar48 + lVar40;
            lVar48 = lVar48 + local_c0;
            pauVar32 = (undefined1 (*) [32])(local_138[1] + lVar39);
            uVar47 = uVar51 & 0xfffffff8;
          }
          auVar110 = auVar161._0_16_;
          if (uVar51 - uVar47 != 0 && (int)uVar47 <= (int)uVar51) {
            lVar39 = 0;
            do {
              auVar359 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar38 + lVar39 * 4 + lVar3)),
                                       ZEXT416(*(uint *)((long)pvVar38 + lVar39 * 4 + lVar4)),0x10);
              auVar359 = vinsertps_avx(auVar359,ZEXT416(*(uint *)((long)pvVar38 + lVar39 * 4 + lVar5
                                                                 )),0x20);
              auVar359 = vinsertps_avx(auVar359,ZEXT416(*(uint *)((long)pvVar38 + lVar39 * 4 + lVar6
                                                                 )),0x30);
              auVar78 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar38 + lVar39 * 4 + lVar48)),
                                      ZEXT416(*(uint *)((long)pvVar38 + lVar39 * 4 + lVar50)),0x10);
              auVar78 = vinsertps_avx(auVar78,ZEXT416(*(uint *)((long)pvVar38 + lVar39 * 4 + lVar1))
                                      ,0x20);
              auVar78 = vinsertps_avx(auVar78,ZEXT416(*(uint *)((long)pvVar38 + lVar39 * 4 + lVar2))
                                      ,0x30);
              uVar7 = *(undefined4 *)(*pauVar32 + lVar39 * 4);
              auVar246._4_4_ = uVar7;
              auVar246._0_4_ = uVar7;
              auVar246._8_4_ = uVar7;
              auVar246._12_4_ = uVar7;
              auVar246._16_4_ = uVar7;
              auVar246._20_4_ = uVar7;
              auVar246._24_4_ = uVar7;
              auVar246._28_4_ = uVar7;
              auVar291._16_16_ = auVar359;
              auVar291._0_16_ = auVar78;
              auVar359 = vfmadd231ps_fma(auVar162._0_32_,auVar291,auVar246);
              auVar162 = ZEXT1664(auVar359);
              auVar244 = ZEXT1632(auVar359);
              lVar39 = lVar39 + 1;
            } while (uVar51 - uVar47 != (int)lVar39);
          }
          auVar161 = vhaddps_avx(ZEXT1632(auVar164),auVar161);
          auVar67 = vhaddps_avx(auVar96,auVar67);
          auVar67 = vhaddps_avx(auVar161,auVar67);
          auVar98 = vhaddps_avx(ZEXT1632(auVar201),auVar98);
          auVar96 = vhaddps_avx(ZEXT1632(auVar59),auVar366);
          auVar96 = vhaddps_avx(auVar98,auVar96);
          auVar98 = vblendps_avx(auVar67,auVar96,0xf0);
          auVar96 = vperm2f128_avx(auVar67,auVar96,0x21);
          fVar108 = auVar96._0_4_ + auVar98._0_4_ + auVar244._0_4_;
          fVar71 = auVar96._4_4_ + auVar98._4_4_ + auVar244._4_4_;
          auVar67._0_8_ = CONCAT44(fVar71,fVar108);
          auVar67._8_4_ = auVar96._8_4_ + auVar98._8_4_ + auVar244._8_4_;
          auVar67._12_4_ = auVar96._12_4_ + auVar98._12_4_ + auVar244._12_4_;
          auVar67._16_4_ = auVar96._16_4_ + auVar98._16_4_ + auVar244._16_4_;
          auVar67._20_4_ = auVar96._20_4_ + auVar98._20_4_ + auVar244._20_4_;
          auVar67._24_4_ = auVar96._24_4_ + auVar98._24_4_ + auVar244._24_4_;
          auVar67._28_4_ = auVar96._28_4_ + auVar98._28_4_ + auVar244._28_4_;
          auVar98 = auVar106._0_32_;
          auVar244 = auVar250._0_32_;
          fVar302 = auVar250._0_4_;
          fVar163 = auVar250._4_4_;
          fVar322 = auVar250._8_4_;
          fVar323 = auVar250._12_4_;
          fVar324 = auVar250._16_4_;
          fVar325 = auVar250._20_4_;
          fVar72 = auVar250._24_4_;
          fVar107 = auVar250._28_4_;
          switch(uVar33) {
          case 1:
            auVar67 = vmaxps_avx(auVar98,auVar67);
            break;
          case 2:
            auVar244 = vmaxps_avx(auVar98,auVar67);
            auVar98 = vminps_avx(auVar98,auVar67);
            uVar7 = *(this->super_InnerProduct).activation_params.data;
            auVar70._4_4_ = uVar7;
            auVar70._0_4_ = uVar7;
            auVar70._8_4_ = uVar7;
            auVar70._12_4_ = uVar7;
            auVar70._16_4_ = uVar7;
            auVar70._20_4_ = uVar7;
            auVar70._24_4_ = uVar7;
            auVar70._28_4_ = uVar7;
            auVar164 = vfmadd213ps_fma(auVar70,auVar98,auVar244);
            auVar67 = ZEXT1632(auVar164);
            break;
          case 3:
            puVar20 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar7 = *puVar20;
            auVar101._4_4_ = uVar7;
            auVar101._0_4_ = uVar7;
            auVar101._8_4_ = uVar7;
            auVar101._12_4_ = uVar7;
            auVar101._16_4_ = uVar7;
            auVar101._20_4_ = uVar7;
            auVar101._24_4_ = uVar7;
            auVar101._28_4_ = uVar7;
            uVar7 = puVar20[1];
            auVar158._4_4_ = uVar7;
            auVar158._0_4_ = uVar7;
            auVar158._8_4_ = uVar7;
            auVar158._12_4_ = uVar7;
            auVar158._16_4_ = uVar7;
            auVar158._20_4_ = uVar7;
            auVar158._24_4_ = uVar7;
            auVar158._28_4_ = uVar7;
            auVar244 = vmaxps_avx(auVar67,auVar101);
            auVar67 = vminps_avx(auVar244,auVar158);
            break;
          case 4:
            auVar66._0_8_ = auVar67._0_8_ ^ 0x8000000080000000;
            auVar66._8_4_ = -auVar67._8_4_;
            auVar66._12_4_ = -auVar67._12_4_;
            auVar66._16_4_ = -auVar67._16_4_;
            auVar66._20_4_ = -auVar67._20_4_;
            auVar66._24_4_ = -auVar67._24_4_;
            auVar66._28_4_ = -auVar67._28_4_;
            auVar102._8_4_ = 0x42b0c0a5;
            auVar102._0_8_ = 0x42b0c0a542b0c0a5;
            auVar102._12_4_ = 0x42b0c0a5;
            auVar102._16_4_ = 0x42b0c0a5;
            auVar102._20_4_ = 0x42b0c0a5;
            auVar102._24_4_ = 0x42b0c0a5;
            auVar102._28_4_ = 0x42b0c0a5;
            auVar98 = vminps_avx(auVar66,auVar102);
            auVar103._8_4_ = 0xc2b0c0a5;
            auVar103._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar103._12_4_ = 0xc2b0c0a5;
            auVar103._16_4_ = 0xc2b0c0a5;
            auVar103._20_4_ = 0xc2b0c0a5;
            auVar103._24_4_ = 0xc2b0c0a5;
            auVar103._28_4_ = 0xc2b0c0a5;
            auVar67 = vmaxps_avx(auVar98,auVar103);
            auVar104._8_4_ = 0x3fb8aa3b;
            auVar104._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar104._12_4_ = 0x3fb8aa3b;
            auVar104._16_4_ = 0x3fb8aa3b;
            auVar104._20_4_ = 0x3fb8aa3b;
            auVar104._24_4_ = 0x3fb8aa3b;
            auVar104._28_4_ = 0x3fb8aa3b;
            auVar280._8_4_ = 0x3f000000;
            auVar280._0_8_ = 0x3f0000003f000000;
            auVar280._12_4_ = 0x3f000000;
            auVar280._16_4_ = 0x3f000000;
            auVar280._20_4_ = 0x3f000000;
            auVar280._24_4_ = 0x3f000000;
            auVar280._28_4_ = 0x3f000000;
            auVar164 = vfmadd213ps_fma(auVar104,auVar67,auVar280);
            auVar96 = vroundps_avx(ZEXT1632(auVar164),1);
            auVar98 = vcmpps_avx(ZEXT1632(auVar164),auVar96,1);
            auVar98 = vandps_avx(auVar98,auVar244);
            auVar98 = vsubps_avx(auVar96,auVar98);
            auVar159._8_4_ = 0x3f318000;
            auVar159._0_8_ = 0x3f3180003f318000;
            auVar159._12_4_ = 0x3f318000;
            auVar159._16_4_ = 0x3f318000;
            auVar159._20_4_ = 0x3f318000;
            auVar159._24_4_ = 0x3f318000;
            auVar159._28_4_ = 0x3f318000;
            auVar164 = vfmsub231ps_fma(auVar67,auVar98,auVar159);
            auVar160._8_4_ = 0x395e8083;
            auVar160._0_8_ = 0x395e8083395e8083;
            auVar160._12_4_ = 0x395e8083;
            auVar160._16_4_ = 0x395e8083;
            auVar160._20_4_ = 0x395e8083;
            auVar160._24_4_ = 0x395e8083;
            auVar160._28_4_ = 0x395e8083;
            auVar201 = vfmsub231ps_fma(ZEXT1632(auVar164),auVar98,auVar160);
            auVar67 = ZEXT1632(auVar201);
            auVar28._28_4_ = 0x395e8083;
            auVar28._0_28_ =
                 ZEXT1628(CONCAT412(auVar201._12_4_ * auVar201._12_4_,
                                    CONCAT48(auVar201._8_4_ * auVar201._8_4_,
                                             CONCAT44(auVar201._4_4_ * auVar201._4_4_,
                                                      auVar201._0_4_ * auVar201._0_4_))));
            auVar226._8_4_ = 0x39506967;
            auVar226._0_8_ = 0x3950696739506967;
            auVar226._12_4_ = 0x39506967;
            auVar226._16_4_ = 0x39506967;
            auVar226._20_4_ = 0x39506967;
            auVar226._24_4_ = 0x39506967;
            auVar226._28_4_ = 0x39506967;
            auVar248._8_4_ = 0x3ab743ce;
            auVar248._0_8_ = 0x3ab743ce3ab743ce;
            auVar248._12_4_ = 0x3ab743ce;
            auVar248._16_4_ = 0x3ab743ce;
            auVar248._20_4_ = 0x3ab743ce;
            auVar248._24_4_ = 0x3ab743ce;
            auVar248._28_4_ = 0x3ab743ce;
            auVar164 = vfmadd213ps_fma(auVar226,auVar67,auVar248);
            auVar249._8_4_ = 0x3c088908;
            auVar249._0_8_ = 0x3c0889083c088908;
            auVar249._12_4_ = 0x3c088908;
            auVar249._16_4_ = 0x3c088908;
            auVar249._20_4_ = 0x3c088908;
            auVar249._24_4_ = 0x3c088908;
            auVar249._28_4_ = 0x3c088908;
            auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar67,auVar249);
            auVar193._8_4_ = 0x3d2aa9c1;
            auVar193._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar193._12_4_ = 0x3d2aa9c1;
            auVar193._16_4_ = 0x3d2aa9c1;
            auVar193._20_4_ = 0x3d2aa9c1;
            auVar193._24_4_ = 0x3d2aa9c1;
            auVar193._28_4_ = 0x3d2aa9c1;
            auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar67,auVar193);
            auVar194._8_4_ = 0x3e2aaaaa;
            auVar194._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar194._12_4_ = 0x3e2aaaaa;
            auVar194._16_4_ = 0x3e2aaaaa;
            auVar194._20_4_ = 0x3e2aaaaa;
            auVar194._24_4_ = 0x3e2aaaaa;
            auVar194._28_4_ = 0x3e2aaaaa;
            auVar67 = ZEXT1632(auVar201);
            auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar67,auVar194);
            auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar67,auVar280);
            auVar59 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar28,auVar67);
            auVar58._0_4_ = (int)auVar98._0_4_;
            auVar58._4_4_ = (int)auVar98._4_4_;
            auVar58._8_4_ = (int)auVar98._8_4_;
            auVar58._12_4_ = (int)auVar98._12_4_;
            auVar68._16_4_ = (int)auVar98._16_4_;
            auVar68._0_16_ = auVar58;
            auVar68._20_4_ = (int)auVar98._20_4_;
            auVar68._24_4_ = (int)auVar98._24_4_;
            auVar68._28_4_ = (int)auVar98._28_4_;
            auVar201 = vpslld_avx(auVar58,0x17);
            auVar164 = vpslld_avx(auVar68._16_16_,0x17);
            auVar120._8_4_ = 0x3f800000;
            auVar120._0_8_ = 0x3f8000003f800000;
            auVar120._12_4_ = 0x3f800000;
            auVar164 = vpaddd_avx(auVar164,auVar120);
            auVar201 = vpaddd_avx(auVar201,auVar120);
            auVar69._16_16_ = auVar164;
            auVar69._0_16_ = auVar201;
            auVar105._0_4_ = auVar59._0_4_ + fVar302;
            auVar105._4_4_ = auVar59._4_4_ + fVar163;
            auVar105._8_4_ = auVar59._8_4_ + fVar322;
            auVar105._12_4_ = auVar59._12_4_ + fVar323;
            auVar105._16_4_ = fVar324 + 0.0;
            auVar105._20_4_ = fVar325 + 0.0;
            auVar105._24_4_ = fVar72 + 0.0;
            auVar105._28_4_ = fVar107 + 0.0;
            auVar164 = vfmadd213ps_fma(auVar69,auVar105,auVar244);
            auVar67 = vdivps_avx(auVar244,ZEXT1632(auVar164));
            break;
          case 5:
            auVar320._8_4_ = 0x42b0c0a5;
            auVar320._0_8_ = 0x42b0c0a542b0c0a5;
            auVar320._12_4_ = 0x42b0c0a5;
            auVar320._16_4_ = 0x42b0c0a5;
            auVar320._20_4_ = 0x42b0c0a5;
            auVar320._24_4_ = 0x42b0c0a5;
            auVar320._28_4_ = 0x42b0c0a5;
            auVar98 = vminps_avx(auVar320,auVar67);
            auVar340._8_4_ = 0xc2b0c0a5;
            auVar340._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar340._12_4_ = 0xc2b0c0a5;
            auVar340._16_4_ = 0xc2b0c0a5;
            auVar340._20_4_ = 0xc2b0c0a5;
            auVar340._24_4_ = 0xc2b0c0a5;
            auVar340._28_4_ = 0xc2b0c0a5;
            auVar96 = vmaxps_avx(auVar340,auVar98);
            auVar150._8_4_ = 0x3fb8aa3b;
            auVar150._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar150._12_4_ = 0x3fb8aa3b;
            auVar150._16_4_ = 0x3fb8aa3b;
            auVar150._20_4_ = 0x3fb8aa3b;
            auVar150._24_4_ = 0x3fb8aa3b;
            auVar150._28_4_ = 0x3fb8aa3b;
            auVar191._8_4_ = 0x3f000000;
            auVar191._0_8_ = 0x3f0000003f000000;
            auVar191._12_4_ = 0x3f000000;
            auVar191._16_4_ = 0x3f000000;
            auVar191._20_4_ = 0x3f000000;
            auVar191._24_4_ = 0x3f000000;
            auVar191._28_4_ = 0x3f000000;
            auVar110 = vfmadd213ps_fma(auVar150,auVar96,auVar191);
            auVar161 = vroundps_avx(ZEXT1632(auVar110),1);
            auVar98 = vcmpps_avx(ZEXT1632(auVar110),auVar161,1);
            auVar98 = vandps_avx(auVar98,auVar244);
            auVar98 = vsubps_avx(auVar161,auVar98);
            auVar356._8_4_ = 0x3f318000;
            auVar356._0_8_ = 0x3f3180003f318000;
            auVar356._12_4_ = 0x3f318000;
            auVar356._16_4_ = 0x3f318000;
            auVar356._20_4_ = 0x3f318000;
            auVar356._24_4_ = 0x3f318000;
            auVar356._28_4_ = 0x3f318000;
            auVar110 = vfmsub231ps_fma(auVar96,auVar98,auVar356);
            auVar341._8_4_ = 0xb95e8083;
            auVar341._0_8_ = 0xb95e8083b95e8083;
            auVar341._12_4_ = 0xb95e8083;
            auVar341._16_4_ = 0xb95e8083;
            auVar341._20_4_ = 0xb95e8083;
            auVar341._24_4_ = 0xb95e8083;
            auVar341._28_4_ = 0xb95e8083;
            auVar201 = vfnmsub231ps_fma(ZEXT1632(auVar110),auVar98,auVar341);
            auVar96 = ZEXT1632(auVar201);
            auVar366._28_4_ = auVar161._28_4_;
            auVar366._0_28_ =
                 ZEXT1628(CONCAT412(auVar201._12_4_ * auVar201._12_4_,
                                    CONCAT48(auVar201._8_4_ * auVar201._8_4_,
                                             CONCAT44(auVar201._4_4_ * auVar201._4_4_,
                                                      auVar201._0_4_ * auVar201._0_4_))));
            auVar374._8_4_ = 0x39506967;
            auVar374._0_8_ = 0x3950696739506967;
            auVar374._12_4_ = 0x39506967;
            auVar374._16_4_ = 0x39506967;
            auVar374._20_4_ = 0x39506967;
            auVar374._24_4_ = 0x39506967;
            auVar374._28_4_ = 0x39506967;
            auVar367._8_4_ = 0x3ab743ce;
            auVar367._0_8_ = 0x3ab743ce3ab743ce;
            auVar367._12_4_ = 0x3ab743ce;
            auVar367._16_4_ = 0x3ab743ce;
            auVar367._20_4_ = 0x3ab743ce;
            auVar367._24_4_ = 0x3ab743ce;
            auVar367._28_4_ = 0x3ab743ce;
            auVar110 = vfmadd213ps_fma(auVar374,auVar96,auVar367);
            auVar261._8_4_ = 0x3c088908;
            auVar261._0_8_ = 0x3c0889083c088908;
            auVar261._12_4_ = 0x3c088908;
            auVar261._16_4_ = 0x3c088908;
            auVar261._20_4_ = 0x3c088908;
            auVar261._24_4_ = 0x3c088908;
            auVar261._28_4_ = 0x3c088908;
            auVar110 = vfmadd213ps_fma(ZEXT1632(auVar110),auVar96,auVar261);
            auVar192._8_4_ = 0x3d2aa9c1;
            auVar192._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar192._12_4_ = 0x3d2aa9c1;
            auVar192._16_4_ = 0x3d2aa9c1;
            auVar192._20_4_ = 0x3d2aa9c1;
            auVar192._24_4_ = 0x3d2aa9c1;
            auVar192._28_4_ = 0x3d2aa9c1;
            auVar164 = vfmadd213ps_fma(ZEXT1632(auVar110),auVar96,auVar192);
            auVar110._8_4_ = 0x3e2aaaaa;
            auVar110._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar110._12_4_ = 0x3e2aaaaa;
            auVar349._16_4_ = 0x3e2aaaaa;
            auVar349._0_16_ = auVar110;
            auVar349._20_4_ = 0x3e2aaaaa;
            auVar349._24_4_ = 0x3e2aaaaa;
            auVar349._28_4_ = 0x3e2aaaaa;
            auVar96 = ZEXT1632(auVar201);
            auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar96,auVar349);
            auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar96,auVar191);
            auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar366,auVar96);
            auVar223._0_4_ = fVar302 + auVar164._0_4_;
            auVar223._4_4_ = fVar163 + auVar164._4_4_;
            auVar223._8_4_ = fVar322 + auVar164._8_4_;
            auVar223._12_4_ = fVar323 + auVar164._12_4_;
            auVar223._16_4_ = fVar324 + 0.0;
            auVar223._20_4_ = fVar325 + 0.0;
            auVar223._24_4_ = fVar72 + 0.0;
            auVar223._28_4_ = fVar107 + 0.0;
            auVar164._0_4_ = (int)auVar98._0_4_;
            auVar164._4_4_ = (int)auVar98._4_4_;
            auVar164._8_4_ = (int)auVar98._8_4_;
            auVar164._12_4_ = (int)auVar98._12_4_;
            auVar97._16_4_ = (int)auVar98._16_4_;
            auVar97._0_16_ = auVar164;
            auVar97._20_4_ = (int)auVar98._20_4_;
            auVar97._24_4_ = (int)auVar98._24_4_;
            auVar97._28_4_ = (int)auVar98._28_4_;
            auVar201 = vpslld_avx(auVar164,0x17);
            auVar164 = vpslld_avx(auVar97._16_16_,0x17);
            auVar359._8_4_ = 0x3f800000;
            auVar359._0_8_ = 0x3f8000003f800000;
            auVar359._12_4_ = 0x3f800000;
            auVar164 = vpaddd_avx(auVar164,auVar359);
            auVar201 = vpaddd_avx(auVar201,auVar359);
            auVar98._16_16_ = auVar164;
            auVar98._0_16_ = auVar201;
            auVar59 = vfmadd213ps_fma(auVar98,auVar223,auVar244);
            auVar151._8_4_ = 0x800000;
            auVar151._0_8_ = 0x80000000800000;
            auVar151._12_4_ = 0x800000;
            auVar151._16_4_ = 0x800000;
            auVar151._20_4_ = 0x800000;
            auVar151._24_4_ = 0x800000;
            auVar151._28_4_ = 0x800000;
            auVar98 = vmaxps_avx(ZEXT1632(auVar59),auVar151);
            auVar201 = vpsrld_avx(auVar98._0_16_,0x17);
            auVar164 = vpsrld_avx(auVar98._16_16_,0x17);
            auVar275._8_4_ = 0x807fffff;
            auVar275._0_8_ = 0x807fffff807fffff;
            auVar275._12_4_ = 0x807fffff;
            auVar275._16_4_ = 0x807fffff;
            auVar275._20_4_ = 0x807fffff;
            auVar275._24_4_ = 0x807fffff;
            auVar275._28_4_ = 0x807fffff;
            auVar98 = vandps_avx(auVar275,auVar98);
            auVar161 = vorps_avx(auVar98,auVar191);
            auVar276._8_4_ = 0x3f3504f3;
            auVar276._0_8_ = 0x3f3504f33f3504f3;
            auVar276._12_4_ = 0x3f3504f3;
            auVar276._16_4_ = 0x3f3504f3;
            auVar276._20_4_ = 0x3f3504f3;
            auVar276._24_4_ = 0x3f3504f3;
            auVar276._28_4_ = 0x3f3504f3;
            auVar96 = vcmpps_avx(auVar276,auVar161,2);
            auVar98 = vandnps_avx(auVar96,auVar161);
            auVar262._8_4_ = 0xbf800000;
            auVar262._0_8_ = 0xbf800000bf800000;
            auVar262._12_4_ = 0xbf800000;
            auVar262._16_4_ = 0xbf800000;
            auVar262._20_4_ = 0xbf800000;
            auVar262._24_4_ = 0xbf800000;
            auVar262._28_4_ = 0xbf800000;
            auVar152._0_4_ = auVar98._0_4_ + auVar161._0_4_ + -1.0;
            auVar152._4_4_ = auVar98._4_4_ + auVar161._4_4_ + -1.0;
            auVar152._8_4_ = auVar98._8_4_ + auVar161._8_4_ + -1.0;
            auVar152._12_4_ = auVar98._12_4_ + auVar161._12_4_ + -1.0;
            auVar152._16_4_ = auVar98._16_4_ + auVar161._16_4_ + -1.0;
            auVar152._20_4_ = auVar98._20_4_ + auVar161._20_4_ + -1.0;
            auVar152._24_4_ = auVar98._24_4_ + auVar161._24_4_ + -1.0;
            auVar152._28_4_ = auVar98._28_4_ + auVar161._28_4_ + -1.0;
            auVar164 = vpsubd_avx(auVar164,auVar96._16_16_);
            auVar78._8_4_ = 0xffffff81;
            auVar78._0_8_ = 0xffffff81ffffff81;
            auVar78._12_4_ = 0xffffff81;
            auVar164 = vpaddd_avx(auVar78,auVar164);
            auVar201 = vpsubd_avx(auVar201,auVar96._0_16_);
            auVar201 = vpaddd_avx(auVar78,auVar201);
            auVar224._16_16_ = auVar164;
            auVar224._0_16_ = auVar201;
            auVar247._0_4_ = auVar152._0_4_ * auVar152._0_4_;
            auVar247._4_4_ = auVar152._4_4_ * auVar152._4_4_;
            auVar247._8_4_ = auVar152._8_4_ * auVar152._8_4_;
            auVar247._12_4_ = auVar152._12_4_ * auVar152._12_4_;
            auVar247._16_4_ = auVar152._16_4_ * auVar152._16_4_;
            auVar247._20_4_ = auVar152._20_4_ * auVar152._20_4_;
            auVar247._24_4_ = auVar152._24_4_ * auVar152._24_4_;
            auVar247._28_4_ = 0;
            auVar277._8_4_ = 0x3d9021bb;
            auVar277._0_8_ = 0x3d9021bb3d9021bb;
            auVar277._12_4_ = 0x3d9021bb;
            auVar277._16_4_ = 0x3d9021bb;
            auVar277._20_4_ = 0x3d9021bb;
            auVar277._24_4_ = 0x3d9021bb;
            auVar277._28_4_ = 0x3d9021bb;
            auVar292._8_4_ = 0xbdebd1b8;
            auVar292._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar292._12_4_ = 0xbdebd1b8;
            auVar292._16_4_ = 0xbdebd1b8;
            auVar292._20_4_ = 0xbdebd1b8;
            auVar292._24_4_ = 0xbdebd1b8;
            auVar292._28_4_ = 0xbdebd1b8;
            auVar164 = vfmadd213ps_fma(auVar277,auVar152,auVar292);
            auVar293._8_4_ = 0x3def251a;
            auVar293._0_8_ = 0x3def251a3def251a;
            auVar293._12_4_ = 0x3def251a;
            auVar293._16_4_ = 0x3def251a;
            auVar293._20_4_ = 0x3def251a;
            auVar293._24_4_ = 0x3def251a;
            auVar293._28_4_ = 0x3def251a;
            auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar152,auVar293);
            auVar294._8_4_ = 0xbdfe5d4f;
            auVar294._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar294._12_4_ = 0xbdfe5d4f;
            auVar294._16_4_ = 0xbdfe5d4f;
            auVar294._20_4_ = 0xbdfe5d4f;
            auVar294._24_4_ = 0xbdfe5d4f;
            auVar294._28_4_ = 0xbdfe5d4f;
            auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar152,auVar294);
            auVar295._8_4_ = 0x3e11e9bf;
            auVar295._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar295._12_4_ = 0x3e11e9bf;
            auVar295._16_4_ = 0x3e11e9bf;
            auVar295._20_4_ = 0x3e11e9bf;
            auVar295._24_4_ = 0x3e11e9bf;
            auVar295._28_4_ = 0x3e11e9bf;
            auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar152,auVar295);
            auVar296._8_4_ = 0xbe2aae50;
            auVar296._0_8_ = 0xbe2aae50be2aae50;
            auVar296._12_4_ = 0xbe2aae50;
            auVar296._16_4_ = 0xbe2aae50;
            auVar296._20_4_ = 0xbe2aae50;
            auVar296._24_4_ = 0xbe2aae50;
            auVar296._28_4_ = 0xbe2aae50;
            auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar152,auVar296);
            auVar297._8_4_ = 0x3e4cceac;
            auVar297._0_8_ = 0x3e4cceac3e4cceac;
            auVar297._12_4_ = 0x3e4cceac;
            auVar297._16_4_ = 0x3e4cceac;
            auVar297._20_4_ = 0x3e4cceac;
            auVar297._24_4_ = 0x3e4cceac;
            auVar297._28_4_ = 0x3e4cceac;
            auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar152,auVar297);
            auVar298._8_4_ = 0xbe7ffffc;
            auVar298._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar298._12_4_ = 0xbe7ffffc;
            auVar298._16_4_ = 0xbe7ffffc;
            auVar298._20_4_ = 0xbe7ffffc;
            auVar298._24_4_ = 0xbe7ffffc;
            auVar298._28_4_ = 0xbe7ffffc;
            auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar152,auVar298);
            auVar299._8_4_ = 0x3eaaaaaa;
            auVar299._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar299._12_4_ = 0x3eaaaaaa;
            auVar299._16_4_ = 0x3eaaaaaa;
            auVar299._20_4_ = 0x3eaaaaaa;
            auVar299._24_4_ = 0x3eaaaaaa;
            auVar299._28_4_ = 0x3eaaaaaa;
            auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar152,auVar299);
            auVar278._0_4_ = auVar247._0_4_ * auVar152._0_4_ * auVar164._0_4_;
            auVar278._4_4_ = auVar247._4_4_ * auVar152._4_4_ * auVar164._4_4_;
            auVar278._8_4_ = auVar247._8_4_ * auVar152._8_4_ * auVar164._8_4_;
            auVar278._12_4_ = auVar247._12_4_ * auVar152._12_4_ * auVar164._12_4_;
            auVar278._16_4_ = auVar247._16_4_ * auVar152._16_4_ * 0.0;
            auVar278._20_4_ = auVar247._20_4_ * auVar152._20_4_ * 0.0;
            auVar278._24_4_ = auVar247._24_4_ * auVar152._24_4_ * 0.0;
            auVar278._28_4_ = 0;
            auVar96 = vcvtdq2ps_avx(auVar224);
            auVar164 = vfmadd231ps_fma(auVar278,auVar96,auVar341);
            auVar164 = vfmsub231ps_fma(ZEXT1632(auVar164),auVar191,auVar247);
            auVar98 = vcmpps_avx(ZEXT1632(auVar59),_DAT_005f5320,2);
            auVar161 = vsubps_avx(ZEXT1632(auVar164),auVar152);
            auVar164 = vfmsub231ps_fma(auVar161,auVar356,auVar96);
            auVar300._8_4_ = 0xc0000000;
            auVar300._0_8_ = 0xc0000000c0000000;
            auVar300._12_4_ = 0xc0000000;
            auVar300._16_4_ = 0xc0000000;
            auVar300._20_4_ = 0xc0000000;
            auVar300._24_4_ = 0xc0000000;
            auVar300._28_4_ = 0xc0000000;
            auVar153._0_4_ = auVar164._0_4_ * -2.0;
            auVar153._4_4_ = auVar164._4_4_ * -2.0;
            auVar153._8_4_ = auVar164._8_4_ * -2.0;
            auVar153._12_4_ = auVar164._12_4_ * -2.0;
            auVar153._16_4_ = 0x80000000;
            auVar153._20_4_ = 0x80000000;
            auVar153._24_4_ = 0x80000000;
            auVar153._28_4_ = 0;
            auVar225._8_4_ = 0x7fffffff;
            auVar225._0_8_ = 0x7fffffff7fffffff;
            auVar225._12_4_ = 0x7fffffff;
            auVar225._16_4_ = 0x7fffffff;
            auVar225._20_4_ = 0x7fffffff;
            auVar225._24_4_ = 0x7fffffff;
            auVar225._28_4_ = 0x7fffffff;
            auVar98 = vblendvps_avx(auVar153,auVar225,auVar98);
            auVar154._8_4_ = 0x42b0c0a5;
            auVar154._0_8_ = 0x42b0c0a542b0c0a5;
            auVar154._12_4_ = 0x42b0c0a5;
            auVar154._16_4_ = 0x42b0c0a5;
            auVar154._20_4_ = 0x42b0c0a5;
            auVar154._24_4_ = 0x42b0c0a5;
            auVar154._28_4_ = 0x42b0c0a5;
            auVar98 = vminps_avx(auVar98,auVar154);
            auVar155._8_4_ = 0xc2b0c0a5;
            auVar155._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar155._12_4_ = 0xc2b0c0a5;
            auVar155._16_4_ = 0xc2b0c0a5;
            auVar155._20_4_ = 0xc2b0c0a5;
            auVar155._24_4_ = 0xc2b0c0a5;
            auVar155._28_4_ = 0xc2b0c0a5;
            auVar96 = vmaxps_avx(auVar98,auVar155);
            auVar156._8_4_ = 0x3fb8aa3b;
            auVar156._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar156._12_4_ = 0x3fb8aa3b;
            auVar156._16_4_ = 0x3fb8aa3b;
            auVar156._20_4_ = 0x3fb8aa3b;
            auVar156._24_4_ = 0x3fb8aa3b;
            auVar156._28_4_ = 0x3fb8aa3b;
            auVar164 = vfmadd213ps_fma(auVar156,auVar96,auVar191);
            auVar161 = vroundps_avx(ZEXT1632(auVar164),1);
            auVar98 = vcmpps_avx(ZEXT1632(auVar164),auVar161,1);
            auVar98 = vandps_avx(auVar244,auVar98);
            auVar98 = vsubps_avx(auVar161,auVar98);
            auVar164 = vfmsub231ps_fma(auVar96,auVar98,auVar356);
            auVar201 = vfnmsub231ps_fma(ZEXT1632(auVar164),auVar98,auVar341);
            auVar96 = ZEXT1632(auVar201);
            auVar27._28_4_ = auVar161._28_4_;
            auVar27._0_28_ =
                 ZEXT1628(CONCAT412(auVar201._12_4_ * auVar201._12_4_,
                                    CONCAT48(auVar201._8_4_ * auVar201._8_4_,
                                             CONCAT44(auVar201._4_4_ * auVar201._4_4_,
                                                      auVar201._0_4_ * auVar201._0_4_))));
            auVar106 = ZEXT864(0) << 0x20;
            auVar164 = vfmadd213ps_fma(auVar374,auVar96,auVar367);
            auVar279._8_4_ = 0x3c088908;
            auVar279._0_8_ = 0x3c0889083c088908;
            auVar279._12_4_ = 0x3c088908;
            auVar279._16_4_ = 0x3c088908;
            auVar279._20_4_ = 0x3c088908;
            auVar279._24_4_ = 0x3c088908;
            auVar279._28_4_ = 0x3c088908;
            auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar96,auVar279);
            auVar250 = ZEXT3264(auVar244);
            auVar321._8_4_ = 0x3d2aa9c1;
            auVar321._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar321._12_4_ = 0x3d2aa9c1;
            auVar321._16_4_ = 0x3d2aa9c1;
            auVar321._20_4_ = 0x3d2aa9c1;
            auVar321._24_4_ = 0x3d2aa9c1;
            auVar321._28_4_ = 0x3d2aa9c1;
            auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar96,auVar321);
            auVar96 = ZEXT1632(auVar201);
            auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar96,auVar349);
            auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar96,auVar191);
            auVar59 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar27,auVar96);
            auVar201._0_4_ = (int)auVar98._0_4_;
            auVar201._4_4_ = (int)auVar98._4_4_;
            auVar201._8_4_ = (int)auVar98._8_4_;
            auVar201._12_4_ = (int)auVar98._12_4_;
            auVar99._16_4_ = (int)auVar98._16_4_;
            auVar99._0_16_ = auVar201;
            auVar99._20_4_ = (int)auVar98._20_4_;
            auVar99._24_4_ = (int)auVar98._24_4_;
            auVar99._28_4_ = (int)auVar98._28_4_;
            auVar201 = vpslld_avx(auVar201,0x17);
            auVar164 = vpslld_avx(auVar99._16_16_,0x17);
            auVar164 = vpaddd_avx(auVar164,auVar359);
            auVar201 = vpaddd_avx(auVar201,auVar359);
            auVar100._16_16_ = auVar164;
            auVar100._0_16_ = auVar201;
            auVar157._0_4_ = auVar59._0_4_ + fVar302;
            auVar157._4_4_ = auVar59._4_4_ + fVar163;
            auVar157._8_4_ = auVar59._8_4_ + fVar322;
            auVar157._12_4_ = auVar59._12_4_ + fVar323;
            auVar157._16_4_ = fVar324 + 0.0;
            auVar157._20_4_ = fVar325 + 0.0;
            auVar157._24_4_ = fVar72 + 0.0;
            auVar157._28_4_ = fVar107 + 0.0;
            auVar164 = vfmadd213ps_fma(auVar100,auVar157,auVar244);
            auVar244 = vdivps_avx(auVar244,ZEXT1632(auVar164));
            auVar164 = vfnmadd213ps_fma(auVar244,auVar300,auVar262);
            auVar90 = ZEXT1628(auVar164);
            goto LAB_002fcb87;
          case 6:
            puVar20 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar7 = *puVar20;
            auVar96._4_4_ = uVar7;
            auVar96._0_4_ = uVar7;
            auVar96._8_4_ = uVar7;
            auVar96._12_4_ = uVar7;
            auVar96._16_4_ = uVar7;
            auVar96._20_4_ = uVar7;
            auVar96._24_4_ = uVar7;
            auVar96._28_4_ = uVar7;
            uVar7 = puVar20[1];
            auVar161._4_4_ = uVar7;
            auVar161._0_4_ = uVar7;
            auVar161._8_4_ = uVar7;
            auVar161._12_4_ = uVar7;
            auVar161._16_4_ = uVar7;
            auVar161._20_4_ = uVar7;
            auVar161._24_4_ = uVar7;
            auVar161._28_4_ = uVar7;
            auVar164 = vfmadd231ps_fma(auVar161,auVar67,auVar96);
            auVar98 = vmaxps_avx(auVar98,ZEXT1632(auVar164));
            auVar244 = vminps_avx(auVar98,auVar244);
            auVar90 = auVar244._0_28_;
LAB_002fcb87:
            auVar67._4_4_ = auVar90._4_4_ * fVar71;
            auVar67._0_4_ = auVar90._0_4_ * fVar108;
            auVar67._8_4_ = auVar90._8_4_ * auVar67._8_4_;
            auVar67._12_4_ = auVar90._12_4_ * auVar67._12_4_;
            auVar67._16_4_ = auVar90._16_4_ * auVar67._16_4_;
            auVar67._20_4_ = auVar90._20_4_ * auVar67._20_4_;
            auVar67._24_4_ = auVar90._24_4_ * auVar67._24_4_;
          }
          *(undefined1 (*) [32])((long)top_blob->data + uVar36 * 0x20) = auVar67;
          uVar36 = uVar36 + 1;
          lVar37 = lVar37 + local_98;
          lVar41 = lVar41 + local_98;
          local_b8 = local_b8 + local_98;
          lVar49 = lVar49 + local_98;
          lVar40 = lVar40 + local_98;
          local_c0 = local_c0 + local_98;
          lVar48 = local_a8 + local_98;
          lVar50 = local_b0 + local_98;
          local_d0 = this;
          local_c8 = top_blob;
          local_88 = (ulong)uVar33;
        } while (uVar36 != local_90);
      }
      uVar36 = local_d8 & 0xfffffffffffffff8;
      if ((uVar35 >> 2 & 1) != 0) {
        if (pvVar19 == (void *)0x0) {
          auVar164 = ZEXT816(0) << 0x40;
        }
        else {
          auVar164 = *(undefined1 (*) [16])((long)pvVar19 + uVar36 * 4);
        }
        pvVar21 = (this->weight_data_tm).data;
        pvVar38 = (void *)((long)pvVar21 + uVar36 * lVar45 * 4);
        if ((int)uVar51 < 8) {
          uVar47 = 0;
          lVar49 = (uVar36 | 1) * lVar45 * 4;
          lVar40 = (uVar36 | 2) * lVar45 * 4;
          lVar41 = (uVar36 | 3) * lVar45 * 4;
          auVar201 = ZEXT816(0);
          auVar59 = ZEXT816(0);
          auVar359 = ZEXT816(0);
          auVar78 = ZEXT816(0);
          pauVar32 = local_138;
        }
        else {
          uVar47 = uVar51 & 0xfffffff8;
          lVar49 = (uVar36 + 3) * lVar45;
          lVar40 = (uVar36 + 2) * lVar45;
          lVar48 = (uVar36 + 1) * lVar45;
          auVar78 = ZEXT816(0);
          iVar30 = 7;
          auVar359 = ZEXT816(0);
          auVar59 = ZEXT816(0);
          auVar201 = ZEXT816(0);
          lVar37 = 0;
          do {
            lVar50 = lVar37;
            auVar244 = *(undefined1 (*) [32])(*local_138 + lVar50);
            auVar201 = vfmadd231ps_fma(ZEXT1632(auVar201),auVar244,
                                       *(undefined1 (*) [32])((long)pvVar38 + lVar50));
            auVar59 = vfmadd231ps_fma(ZEXT1632(auVar59),auVar244,
                                      *(undefined1 (*) [32])((long)pvVar21 + lVar50 + lVar48 * 4));
            auVar359 = vfmadd231ps_fma(ZEXT1632(auVar359),auVar244,
                                       *(undefined1 (*) [32])((long)pvVar21 + lVar50 + lVar40 * 4));
            auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar244,
                                      *(undefined1 (*) [32])((long)pvVar21 + lVar50 + lVar49 * 4));
            iVar30 = iVar30 + 8;
            lVar37 = lVar50 + 0x20;
          } while (iVar30 < (int)uVar51);
          lVar41 = lVar37 + lVar49 * 4;
          lVar40 = lVar37 + lVar40 * 4;
          lVar49 = lVar37 + lVar48 * 4;
          pvVar38 = (void *)((long)pvVar38 + lVar37);
          pauVar32 = (undefined1 (*) [32])(local_138[1] + lVar50);
        }
        lVar49 = (long)pvVar21 + lVar49;
        lVar40 = (long)pvVar21 + lVar40;
        lVar41 = (long)pvVar21 + lVar41;
        auVar58 = ZEXT816(0) << 0x40;
        if ((int)(uVar47 | 3) < (int)uVar51) {
          auVar136 = ZEXT816(0);
          lVar37 = 0;
          auVar88 = ZEXT816(0);
          auVar250 = ZEXT864(0);
          uVar46 = uVar47;
          do {
            auVar137 = *(undefined1 (*) [16])(*pauVar32 + lVar37);
            auVar58 = vfmadd231ps_fma(auVar58,auVar137,
                                      *(undefined1 (*) [16])((long)pvVar38 + lVar37));
            auVar120 = vfmadd231ps_fma(auVar250._0_16_,auVar137,
                                       *(undefined1 (*) [16])(lVar49 + lVar37));
            auVar250 = ZEXT1664(auVar120);
            auVar88 = vfmadd231ps_fma(auVar88,auVar137,*(undefined1 (*) [16])(lVar40 + lVar37));
            auVar136 = vfmadd231ps_fma(auVar136,auVar137,*(undefined1 (*) [16])(lVar41 + lVar37));
            uVar47 = uVar46 + 4;
            iVar30 = uVar46 + 7;
            lVar37 = lVar37 + 0x10;
            uVar46 = uVar47;
          } while (iVar30 < (int)uVar51);
          pauVar32 = (undefined1 (*) [32])(*pauVar32 + lVar37);
          lVar41 = lVar41 + lVar37;
          lVar40 = lVar40 + lVar37;
          lVar49 = lVar49 + lVar37;
          pvVar38 = (void *)((long)pvVar38 + lVar37);
        }
        else {
          auVar120 = SUB6416(ZEXT864(0),0);
          auVar88 = ZEXT816(0);
          auVar136 = ZEXT816(0);
        }
        if (uVar51 - uVar47 != 0 && (int)uVar47 <= (int)uVar51) {
          lVar37 = 0;
          do {
            auVar137 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar38 + lVar37 * 4)),
                                     ZEXT416(*(uint *)(lVar49 + lVar37 * 4)),0x10);
            auVar137 = vinsertps_avx(auVar137,ZEXT416(*(uint *)(lVar40 + lVar37 * 4)),0x20);
            auVar137 = vinsertps_avx(auVar137,ZEXT416(*(uint *)(lVar41 + lVar37 * 4)),0x30);
            uVar7 = *(undefined4 *)(*pauVar32 + lVar37 * 4);
            auVar305._4_4_ = uVar7;
            auVar305._0_4_ = uVar7;
            auVar305._8_4_ = uVar7;
            auVar305._12_4_ = uVar7;
            auVar164 = vfmadd231ps_fma(auVar164,auVar137,auVar305);
            lVar37 = lVar37 + 1;
          } while (uVar51 - uVar47 != (int)lVar37);
        }
        auVar244 = vhaddps_avx(ZEXT1632(auVar201),ZEXT1632(auVar59));
        auVar98 = vhaddps_avx(ZEXT1632(auVar359),ZEXT1632(auVar78));
        auVar244 = vhaddps_avx(auVar244,auVar98);
        auVar359 = vunpcklps_avx(auVar58,auVar120);
        auVar78 = vunpcklps_avx(auVar88,auVar136);
        auVar59 = vunpckhps_avx(auVar58,auVar120);
        auVar58 = vunpckhps_avx(auVar88,auVar136);
        auVar201 = vmovlhps_avx(auVar359,auVar78);
        auVar78 = vunpckhpd_avx(auVar359,auVar78);
        auVar359 = vmovlhps_avx(auVar59,auVar58);
        auVar58 = vunpckhpd_avx(auVar59,auVar58);
        auVar59._0_4_ =
             auVar78._0_4_ + auVar201._0_4_ + auVar359._0_4_ + auVar58._0_4_ + auVar244._0_4_ +
             auVar244._16_4_ + auVar164._0_4_;
        auVar59._4_4_ =
             auVar78._4_4_ + auVar201._4_4_ + auVar359._4_4_ + auVar58._4_4_ + auVar244._4_4_ +
             auVar244._20_4_ + auVar164._4_4_;
        auVar59._8_4_ =
             auVar78._8_4_ + auVar201._8_4_ + auVar359._8_4_ + auVar58._8_4_ + auVar244._8_4_ +
             auVar244._24_4_ + auVar164._8_4_;
        auVar59._12_4_ =
             auVar78._12_4_ + auVar201._12_4_ + auVar359._12_4_ + auVar58._12_4_ + auVar244._12_4_ +
             auVar244._28_4_ + auVar164._12_4_;
        switch(uVar33) {
        case 1:
          auVar29._12_4_ = 0;
          auVar29._0_12_ = ZEXT412(0);
          auVar59 = vmaxps_avx(auVar59,auVar29 << 0x20);
          break;
        case 2:
          auVar164 = vmaxps_avx(auVar59,ZEXT416(0) << 0x20);
          auVar201 = vminps_avx(auVar59,ZEXT416(0) << 0x20);
          uVar7 = *(this->super_InnerProduct).activation_params.data;
          auVar63._4_4_ = uVar7;
          auVar63._0_4_ = uVar7;
          auVar63._8_4_ = uVar7;
          auVar63._12_4_ = uVar7;
          auVar59 = vfmadd213ps_fma(auVar63,auVar201,auVar164);
          break;
        case 3:
          puVar20 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar7 = *puVar20;
          auVar83._4_4_ = uVar7;
          auVar83._0_4_ = uVar7;
          auVar83._8_4_ = uVar7;
          auVar83._12_4_ = uVar7;
          uVar7 = puVar20[1];
          auVar133._4_4_ = uVar7;
          auVar133._0_4_ = uVar7;
          auVar133._8_4_ = uVar7;
          auVar133._12_4_ = uVar7;
          auVar164 = vmaxps_avx(auVar59,auVar83);
          auVar59 = vminps_avx(auVar164,auVar133);
          break;
        case 4:
          uVar42 = CONCAT44(auVar59._4_4_,auVar59._0_4_);
          auVar60._0_8_ = uVar42 ^ 0x8000000080000000;
          auVar60._8_4_ = -auVar59._8_4_;
          auVar60._12_4_ = -auVar59._12_4_;
          auVar84._8_4_ = 0x42b0c0a5;
          auVar84._0_8_ = 0x42b0c0a542b0c0a5;
          auVar84._12_4_ = 0x42b0c0a5;
          auVar164 = vminps_avx(auVar60,auVar84);
          auVar85._8_4_ = 0xc2b0c0a5;
          auVar85._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar85._12_4_ = 0xc2b0c0a5;
          auVar59 = vmaxps_avx(auVar164,auVar85);
          auVar61._8_4_ = 0x3fb8aa3b;
          auVar61._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar61._12_4_ = 0x3fb8aa3b;
          auVar134._8_4_ = 0x3f000000;
          auVar134._0_8_ = 0x3f0000003f000000;
          auVar134._12_4_ = 0x3f000000;
          auVar164 = vfmadd213ps_fma(auVar61,auVar59,auVar134);
          auVar177._0_4_ = (int)auVar164._0_4_;
          auVar177._4_4_ = (int)auVar164._4_4_;
          auVar177._8_4_ = (int)auVar164._8_4_;
          auVar177._12_4_ = (int)auVar164._12_4_;
          auVar201 = vcvtdq2ps_avx(auVar177);
          auVar164 = vcmpps_avx(auVar164,auVar201,1);
          auVar62._8_4_ = 0x3f800000;
          auVar62._0_8_ = 0x3f8000003f800000;
          auVar62._12_4_ = 0x3f800000;
          auVar164 = vandps_avx(auVar164,auVar62);
          auVar164 = vsubps_avx(auVar201,auVar164);
          auVar217._8_4_ = 0x3f318000;
          auVar217._0_8_ = 0x3f3180003f318000;
          auVar217._12_4_ = 0x3f318000;
          auVar201 = vfmsub213ps_fma(auVar217,auVar164,auVar59);
          auVar86._8_4_ = 0x395e8083;
          auVar86._0_8_ = 0x395e8083395e8083;
          auVar86._12_4_ = 0x395e8083;
          auVar59 = vfmsub213ps_fma(auVar86,auVar164,auVar201);
          auVar218._0_4_ = auVar59._0_4_ * auVar59._0_4_;
          auVar218._4_4_ = auVar59._4_4_ * auVar59._4_4_;
          auVar218._8_4_ = auVar59._8_4_ * auVar59._8_4_;
          auVar218._12_4_ = auVar59._12_4_ * auVar59._12_4_;
          auVar229._8_4_ = 0x3ab743ce;
          auVar229._0_8_ = 0x3ab743ce3ab743ce;
          auVar229._12_4_ = 0x3ab743ce;
          auVar241._8_4_ = 0x39506967;
          auVar241._0_8_ = 0x3950696739506967;
          auVar241._12_4_ = 0x39506967;
          auVar201 = vfmadd213ps_fma(auVar241,auVar59,auVar229);
          auVar230._8_4_ = 0x3c088908;
          auVar230._0_8_ = 0x3c0889083c088908;
          auVar230._12_4_ = 0x3c088908;
          auVar201 = vfmadd231ps_fma(auVar230,auVar59,auVar201);
          auVar242._8_4_ = 0x3d2aa9c1;
          auVar242._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar242._12_4_ = 0x3d2aa9c1;
          auVar201 = vfmadd231ps_fma(auVar242,auVar59,auVar201);
          auVar231._8_4_ = 0x3e2aaaaa;
          auVar231._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar231._12_4_ = 0x3e2aaaaa;
          auVar201 = vfmadd231ps_fma(auVar231,auVar59,auVar201);
          auVar201 = vfmadd213ps_fma(auVar201,auVar59,auVar134);
          auVar201 = vfmadd213ps_fma(auVar201,auVar218,auVar59);
          auVar87._0_4_ = auVar201._0_4_ + 1.0;
          auVar87._4_4_ = auVar201._4_4_ + 1.0;
          auVar87._8_4_ = auVar201._8_4_ + 1.0;
          auVar87._12_4_ = auVar201._12_4_ + 1.0;
          auVar135._0_4_ = (int)auVar164._0_4_;
          auVar135._4_4_ = (int)auVar164._4_4_;
          auVar135._8_4_ = (int)auVar164._8_4_;
          auVar135._12_4_ = (int)auVar164._12_4_;
          auVar164 = vpslld_avx(auVar135,0x17);
          auVar164 = vpaddd_avx(auVar164,auVar62);
          auVar164 = vfmadd213ps_fma(auVar164,auVar87,auVar62);
          auVar59 = vdivps_avx(auVar62,auVar164);
          break;
        case 5:
          auVar79._8_4_ = 0x42b0c0a5;
          auVar79._0_8_ = 0x42b0c0a542b0c0a5;
          auVar79._12_4_ = 0x42b0c0a5;
          auVar110 = vminps_avx(auVar59,auVar79);
          auVar121._8_4_ = 0xc2b0c0a5;
          auVar121._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar121._12_4_ = 0xc2b0c0a5;
          auVar201 = vmaxps_avx(auVar110,auVar121);
          auVar228._8_4_ = 0x3fb8aa3b;
          auVar228._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar228._12_4_ = 0x3fb8aa3b;
          auVar252._8_4_ = 0x3f000000;
          auVar252._0_8_ = 0x3f0000003f000000;
          auVar252._12_4_ = 0x3f000000;
          auVar110 = vfmadd213ps_fma(auVar228,auVar201,auVar252);
          auVar175._0_4_ = (int)auVar110._0_4_;
          auVar175._4_4_ = (int)auVar110._4_4_;
          auVar175._8_4_ = (int)auVar110._8_4_;
          auVar175._12_4_ = (int)auVar110._12_4_;
          auVar164 = vcvtdq2ps_avx(auVar175);
          auVar110 = vcmpps_avx(auVar110,auVar164,1);
          auVar240._8_4_ = 0x3f800000;
          auVar240._0_8_ = 0x3f8000003f800000;
          auVar240._12_4_ = 0x3f800000;
          auVar110 = vandps_avx(auVar110,auVar240);
          auVar164 = vsubps_avx(auVar164,auVar110);
          auVar176._8_4_ = 0x3f318000;
          auVar176._0_8_ = 0x3f3180003f318000;
          auVar176._12_4_ = 0x3f318000;
          auVar110 = vfmsub231ps_fma(auVar201,auVar164,auVar176);
          auVar272._8_4_ = 0xb95e8083;
          auVar272._0_8_ = 0xb95e8083b95e8083;
          auVar272._12_4_ = 0xb95e8083;
          auVar359 = vfnmsub231ps_fma(auVar110,auVar164,auVar272);
          auVar369._0_4_ = auVar359._0_4_ * auVar359._0_4_;
          auVar369._4_4_ = auVar359._4_4_ * auVar359._4_4_;
          auVar369._8_4_ = auVar359._8_4_ * auVar359._8_4_;
          auVar369._12_4_ = auVar359._12_4_ * auVar359._12_4_;
          auVar122._8_4_ = 0x3ab743ce;
          auVar122._0_8_ = 0x3ab743ce3ab743ce;
          auVar122._12_4_ = 0x3ab743ce;
          auVar80._8_4_ = 0x39506967;
          auVar80._0_8_ = 0x3950696739506967;
          auVar80._12_4_ = 0x39506967;
          auVar110 = vfmadd213ps_fma(auVar80,auVar359,auVar122);
          auVar306._8_4_ = 0x3c088908;
          auVar306._0_8_ = 0x3c0889083c088908;
          auVar306._12_4_ = 0x3c088908;
          auVar110 = vfmadd213ps_fma(auVar110,auVar359,auVar306);
          auVar334._8_4_ = 0x3d2aa9c1;
          auVar334._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar334._12_4_ = 0x3d2aa9c1;
          auVar201 = vfmadd213ps_fma(auVar110,auVar359,auVar334);
          auVar110._8_4_ = 0x3e2aaaaa;
          auVar110._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar110._12_4_ = 0x3e2aaaaa;
          auVar201 = vfmadd213ps_fma(auVar201,auVar359,auVar110);
          auVar201 = vfmadd213ps_fma(auVar201,auVar359,auVar252);
          auVar201 = vfmadd213ps_fma(auVar201,auVar369,auVar359);
          auVar206._0_4_ = auVar201._0_4_ + 1.0;
          auVar206._4_4_ = auVar201._4_4_ + 1.0;
          auVar206._8_4_ = auVar201._8_4_ + 1.0;
          auVar206._12_4_ = auVar201._12_4_ + 1.0;
          auVar358._0_4_ = (int)auVar164._0_4_;
          auVar358._4_4_ = (int)auVar164._4_4_;
          auVar358._8_4_ = (int)auVar164._8_4_;
          auVar358._12_4_ = (int)auVar164._12_4_;
          auVar164 = vpslld_avx(auVar358,0x17);
          auVar164 = vpaddd_avx(auVar164,auVar240);
          auVar164 = vfmadd213ps_fma(auVar164,auVar206,auVar240);
          auVar201 = vcmpps_avx(auVar164,ZEXT816(0) << 0x40,2);
          auVar207._8_4_ = 0x800000;
          auVar207._0_8_ = 0x80000000800000;
          auVar207._12_4_ = 0x800000;
          auVar164 = vmaxps_avx(auVar164,auVar207);
          auVar359 = vpsrld_avx(auVar164,0x17);
          auVar370._8_4_ = 0x807fffff;
          auVar370._0_8_ = 0x807fffff807fffff;
          auVar370._12_4_ = 0x807fffff;
          auVar164 = vandps_avx(auVar370,auVar164);
          auVar78 = vorps_avx(auVar164,auVar252);
          auVar371._8_4_ = 0xffffff82;
          auVar371._0_8_ = 0xffffff82ffffff82;
          auVar371._12_4_ = 0xffffff82;
          auVar58 = vpaddd_avx(auVar359,auVar371);
          auVar360._8_4_ = 0x3f3504f3;
          auVar360._0_8_ = 0x3f3504f33f3504f3;
          auVar360._12_4_ = 0x3f3504f3;
          auVar359 = vcmpps_avx(auVar78,auVar360,1);
          auVar164 = vandps_avx(auVar359,auVar78);
          auVar361._0_4_ = auVar78._0_4_ + -1.0 + auVar164._0_4_;
          auVar361._4_4_ = auVar78._4_4_ + -1.0 + auVar164._4_4_;
          auVar361._8_4_ = auVar78._8_4_ + -1.0 + auVar164._8_4_;
          auVar361._12_4_ = auVar78._12_4_ + -1.0 + auVar164._12_4_;
          auVar78 = vcvtdq2ps_avx(auVar58);
          auVar164 = vandps_avx(auVar359,auVar240);
          auVar164 = vsubps_avx(auVar78,auVar164);
          auVar123._8_4_ = 0xbdebd1b8;
          auVar123._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar123._12_4_ = 0xbdebd1b8;
          auVar208._8_4_ = 0x3d9021bb;
          auVar208._0_8_ = 0x3d9021bb3d9021bb;
          auVar208._12_4_ = 0x3d9021bb;
          auVar359 = vfmadd213ps_fma(auVar208,auVar361,auVar123);
          auVar124._8_4_ = 0x3def251a;
          auVar124._0_8_ = 0x3def251a3def251a;
          auVar124._12_4_ = 0x3def251a;
          auVar359 = vfmadd231ps_fma(auVar124,auVar361,auVar359);
          auVar209._8_4_ = 0xbdfe5d4f;
          auVar209._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar209._12_4_ = 0xbdfe5d4f;
          auVar359 = vfmadd231ps_fma(auVar209,auVar361,auVar359);
          auVar125._8_4_ = 0x3e11e9bf;
          auVar125._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar125._12_4_ = 0x3e11e9bf;
          auVar359 = vfmadd231ps_fma(auVar125,auVar361,auVar359);
          auVar210._8_4_ = 0xbe2aae50;
          auVar210._0_8_ = 0xbe2aae50be2aae50;
          auVar210._12_4_ = 0xbe2aae50;
          auVar359 = vfmadd231ps_fma(auVar210,auVar361,auVar359);
          auVar126._8_4_ = 0x3e4cceac;
          auVar126._0_8_ = 0x3e4cceac3e4cceac;
          auVar126._12_4_ = 0x3e4cceac;
          auVar359 = vfmadd231ps_fma(auVar126,auVar361,auVar359);
          auVar211._8_4_ = 0xbe7ffffc;
          auVar211._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar211._12_4_ = 0xbe7ffffc;
          auVar359 = vfmadd231ps_fma(auVar211,auVar361,auVar359);
          auVar127._8_4_ = 0x3eaaaaaa;
          auVar127._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar127._12_4_ = 0x3eaaaaaa;
          auVar359 = vfmadd231ps_fma(auVar127,auVar361,auVar359);
          auVar212._0_4_ = auVar361._0_4_ * auVar361._0_4_;
          auVar212._4_4_ = auVar361._4_4_ * auVar361._4_4_;
          auVar212._8_4_ = auVar361._8_4_ * auVar361._8_4_;
          auVar212._12_4_ = auVar361._12_4_ * auVar361._12_4_;
          auVar128._0_4_ = auVar361._0_4_ * auVar212._0_4_ * auVar359._0_4_;
          auVar128._4_4_ = auVar361._4_4_ * auVar212._4_4_ * auVar359._4_4_;
          auVar128._8_4_ = auVar361._8_4_ * auVar212._8_4_ * auVar359._8_4_;
          auVar128._12_4_ = auVar361._12_4_ * auVar212._12_4_ * auVar359._12_4_;
          auVar359 = vfmadd231ps_fma(auVar128,auVar164,auVar272);
          auVar359 = vfmsub231ps_fma(auVar359,auVar252,auVar212);
          auVar359 = vsubps_avx(auVar359,auVar361);
          auVar164 = vfnmadd231ps_fma(auVar359,auVar176,auVar164);
          auVar129._0_4_ = auVar164._0_4_ + auVar164._0_4_;
          auVar129._4_4_ = auVar164._4_4_ + auVar164._4_4_;
          auVar129._8_4_ = auVar164._8_4_ + auVar164._8_4_;
          auVar129._12_4_ = auVar164._12_4_ + auVar164._12_4_;
          auVar213._8_4_ = 0x7fffffff;
          auVar213._0_8_ = 0x7fffffff7fffffff;
          auVar213._12_4_ = 0x7fffffff;
          auVar164 = vblendvps_avx(auVar129,auVar213,auVar201);
          auVar214._8_4_ = 0x42b0c0a5;
          auVar214._0_8_ = 0x42b0c0a542b0c0a5;
          auVar214._12_4_ = 0x42b0c0a5;
          auVar164 = vminps_avx(auVar164,auVar214);
          auVar215._8_4_ = 0xc2b0c0a5;
          auVar215._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar215._12_4_ = 0xc2b0c0a5;
          auVar359 = vmaxps_avx(auVar164,auVar215);
          auVar164 = vfmadd213ps_fma(auVar228,auVar359,auVar252);
          auVar216._0_4_ = (int)auVar164._0_4_;
          auVar216._4_4_ = (int)auVar164._4_4_;
          auVar216._8_4_ = (int)auVar164._8_4_;
          auVar216._12_4_ = (int)auVar164._12_4_;
          auVar201 = vcvtdq2ps_avx(auVar216);
          auVar164 = vcmpps_avx(auVar164,auVar201,1);
          auVar164 = vandps_avx(auVar164,auVar240);
          auVar164 = vsubps_avx(auVar201,auVar164);
          auVar201 = vfmsub213ps_fma(auVar176,auVar164,auVar359);
          auVar359 = vfnmsub231ps_fma(auVar201,auVar164,auVar272);
          auVar130._8_4_ = 0x3ab743ce;
          auVar130._0_8_ = 0x3ab743ce3ab743ce;
          auVar130._12_4_ = 0x3ab743ce;
          auVar201 = vfmadd213ps_fma(auVar80,auVar359,auVar130);
          auVar201 = vfmadd213ps_fma(auVar201,auVar359,auVar306);
          auVar201 = vfmadd213ps_fma(auVar201,auVar359,auVar334);
          auVar201 = vfmadd213ps_fma(auVar201,auVar359,auVar110);
          auVar201 = vfmadd213ps_fma(auVar201,auVar359,auVar252);
          auVar131._0_4_ = auVar359._0_4_ * auVar359._0_4_;
          auVar131._4_4_ = auVar359._4_4_ * auVar359._4_4_;
          auVar131._8_4_ = auVar359._8_4_ * auVar359._8_4_;
          auVar131._12_4_ = auVar359._12_4_ * auVar359._12_4_;
          auVar201 = vfmadd213ps_fma(auVar201,auVar131,auVar359);
          auVar81._0_4_ = auVar201._0_4_ + 1.0;
          auVar81._4_4_ = auVar201._4_4_ + 1.0;
          auVar81._8_4_ = auVar201._8_4_ + 1.0;
          auVar81._12_4_ = auVar201._12_4_ + 1.0;
          auVar132._0_4_ = (int)auVar164._0_4_;
          auVar132._4_4_ = (int)auVar164._4_4_;
          auVar132._8_4_ = (int)auVar164._8_4_;
          auVar132._12_4_ = (int)auVar164._12_4_;
          auVar164 = vpslld_avx(auVar132,0x17);
          auVar164 = vpaddd_avx(auVar164,auVar240);
          auVar164 = vfmadd213ps_fma(auVar164,auVar81,auVar240);
          auVar82._8_4_ = 0x40000000;
          auVar82._0_8_ = 0x4000000040000000;
          auVar82._12_4_ = 0x40000000;
          auVar164 = vdivps_avx(auVar82,auVar164);
          auVar59 = vfmsub231ps_fma(auVar59,auVar59,auVar164);
          break;
        case 6:
          puVar20 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar7 = *puVar20;
          auVar88._4_4_ = uVar7;
          auVar88._0_4_ = uVar7;
          auVar88._8_4_ = uVar7;
          auVar88._12_4_ = uVar7;
          uVar7 = puVar20[1];
          auVar136._4_4_ = uVar7;
          auVar136._0_4_ = uVar7;
          auVar136._8_4_ = uVar7;
          auVar136._12_4_ = uVar7;
          auVar164 = vfmadd231ps_fma(auVar136,auVar59,auVar88);
          auVar164 = vmaxps_avx(auVar164,ZEXT416(0) << 0x20);
          auVar137._8_4_ = 0x3f800000;
          auVar137._0_8_ = 0x3f8000003f800000;
          auVar137._12_4_ = 0x3f800000;
          auVar164 = vminps_avx(auVar164,auVar137);
          auVar59._0_4_ = auVar164._0_4_ * auVar59._0_4_;
          auVar59._4_4_ = auVar164._4_4_ * auVar59._4_4_;
          auVar59._8_4_ = auVar164._8_4_ * auVar59._8_4_;
          auVar59._12_4_ = auVar164._12_4_ * auVar59._12_4_;
        }
        *(undefined1 (*) [16])((long)top_blob->data + uVar36 * 4) = auVar59;
      }
      iVar31 = (int)uVar36 + (uVar35 >> 2 & 1) * 4;
      iVar30 = 0;
      if ((int)uVar35 <= iVar31) goto LAB_002fd619;
      pfVar22 = (float *)(this->super_InnerProduct).activation_params.data;
      pvVar38 = (this->weight_data_tm).data;
      pvVar21 = top_blob->data;
      local_170 = uVar51 & 0xfffffff8;
      uVar36 = (ulong)iVar31;
      auVar106 = ZEXT3264(_DAT_005f2900);
      auVar162 = ZEXT3264(_DAT_005f2920);
      local_e8._8_8_ = 0x8000000000000000;
      local_e8._0_8_ = 0x8000000000000000;
      auVar195 = ZEXT1664(local_e8);
      auVar110 = vpcmpeqd_avx(auVar110,auVar110);
      auVar250 = ZEXT1664(auVar110);
      do {
        auVar110 = ZEXT816(0) << 0x40;
        if (pvVar19 != (void *)0x0) {
          auVar110 = ZEXT416(*(uint *)((long)pvVar19 + uVar36 * 4));
        }
        pauVar32 = (undefined1 (*) [32])((long)pvVar38 + uVar36 * lVar45 * 4);
        pauVar34 = pauVar44;
        if ((int)uVar51 < 8) {
          auVar244 = SUB6432(ZEXT864(0),0);
          uVar35 = 0;
        }
        else {
          auVar375 = ZEXT864(0);
          iVar30 = 7;
          do {
            auVar164 = vfmadd231ps_fma(auVar375._0_32_,*pauVar34,*pauVar32);
            auVar375 = ZEXT1664(auVar164);
            auVar244 = ZEXT1632(auVar164);
            pauVar34 = pauVar34 + 1;
            pauVar32 = pauVar32 + 1;
            iVar30 = iVar30 + 8;
            uVar35 = local_170;
          } while (iVar30 < (int)uVar51);
        }
        auVar164 = ZEXT816(0) << 0x40;
        uVar47 = uVar35 | 3;
        while ((int)uVar47 < (int)uVar51) {
          auVar164 = vfmadd231ps_fma(auVar164,*(undefined1 (*) [16])*pauVar34,
                                     *(undefined1 (*) [16])*pauVar32);
          pauVar34 = (undefined1 (*) [32])(*pauVar34 + 0x10);
          pauVar32 = (undefined1 (*) [32])(*pauVar32 + 0x10);
          uVar47 = uVar35 + 7;
          uVar35 = uVar35 + 4;
        }
        auVar201 = auVar195._0_16_;
        if ((int)uVar35 < (int)uVar51) {
          uVar42 = CONCAT44(0,~uVar35 + uVar51);
          auVar110 = vblendps_avx(auVar110,_DAT_005f1060,0xe);
          auVar178._8_8_ = 0;
          auVar178._0_8_ = uVar42;
          auVar78 = vpshufd_avx(auVar178,0x44);
          auVar59 = vorps_avx(auVar201,auVar78);
          auVar359 = vorps_avx(auVar201,auVar78);
          uVar43 = 0;
          do {
            auVar136 = auVar110;
            auVar232._8_8_ = 0;
            auVar232._0_8_ = uVar43;
            auVar110 = vpshufd_avx(auVar232,0x44);
            auVar263._16_16_ = auVar110;
            auVar263._0_16_ = auVar110;
            auVar98 = vorps_avx(auVar106._0_32_,auVar263);
            auVar67 = vorps_avx(auVar162._0_32_,auVar263);
            auVar110 = vorps_avx(auVar78,auVar201);
            uVar35 = auVar195._0_4_;
            auVar273._0_4_ = auVar67._16_4_ ^ uVar35;
            uVar47 = auVar195._4_4_;
            auVar273._4_4_ = auVar67._20_4_ ^ uVar47;
            uVar46 = auVar195._8_4_;
            auVar273._8_4_ = auVar67._24_4_ ^ uVar46;
            uVar23 = auVar195._12_4_;
            auVar273._12_4_ = auVar67._28_4_ ^ uVar23;
            auVar120 = vpcmpgtq_avx(auVar273,auVar110);
            auVar307._0_4_ = uVar35 ^ auVar67._0_4_;
            auVar307._4_4_ = uVar47 ^ auVar67._4_4_;
            auVar307._8_4_ = uVar46 ^ auVar67._8_4_;
            auVar307._12_4_ = uVar23 ^ auVar67._12_4_;
            auVar58 = vpcmpgtq_avx(auVar307,auVar59);
            auVar58 = vpackssdw_avx(auVar58,auVar120);
            auVar335._0_4_ = auVar98._16_4_ ^ uVar35;
            auVar335._4_4_ = auVar98._20_4_ ^ uVar47;
            auVar335._8_4_ = auVar98._24_4_ ^ uVar46;
            auVar335._12_4_ = auVar98._28_4_ ^ uVar23;
            auVar88 = vpcmpgtq_avx(auVar335,auVar110);
            auVar336._0_4_ = uVar35 ^ auVar98._0_4_;
            auVar336._4_4_ = uVar47 ^ auVar98._4_4_;
            auVar336._8_4_ = uVar46 ^ auVar98._8_4_;
            auVar336._12_4_ = uVar23 ^ auVar98._12_4_;
            auVar110 = vpcmpgtq_avx(auVar336,auVar359);
            auVar110 = vpackssdw_avx(auVar110,auVar88);
            auVar110 = vpackssdw_avx(auVar110 ^ auVar250._0_16_,auVar58 ^ auVar250._0_16_);
            auVar58 = vpmovsxwd_avx(auVar110);
            auVar110 = vpunpckhwd_avx(auVar110,auVar110);
            auVar342._16_16_ = auVar110;
            auVar342._0_16_ = auVar58;
            auVar96 = vmaskmovps_avx(auVar342,*(undefined1 (*) [32])(*pauVar34 + uVar43 * 4));
            auVar161 = vmaskmovps_avx(auVar342,*(undefined1 (*) [32])(*pauVar32 + uVar43 * 4));
            auVar110 = vfmadd213ps_fma(auVar161,auVar96,ZEXT1632(auVar136));
            auVar58 = vpcmpeqd_avx(auVar96._0_16_,auVar96._0_16_);
            auVar250 = ZEXT1664(auVar58);
            uVar43 = uVar43 + 8;
          } while ((uVar42 + 8 & 0xfffffffffffffff8) != uVar43);
          auVar59 = vorps_avx(auVar201,auVar78);
          auVar243._0_4_ = uVar35 ^ auVar67._0_4_;
          auVar243._4_4_ = uVar47 ^ auVar67._4_4_;
          auVar243._8_4_ = uVar46 ^ auVar67._8_4_;
          auVar243._12_4_ = uVar23 ^ auVar67._12_4_;
          auVar59 = vpcmpgtq_avx(auVar243,auVar59);
          auVar59 = vpackssdw_avx(auVar59,auVar120);
          auVar201 = vorps_avx(auVar201,auVar78);
          auVar233._0_4_ = uVar35 ^ auVar98._0_4_;
          auVar233._4_4_ = uVar47 ^ auVar98._4_4_;
          auVar233._8_4_ = uVar46 ^ auVar98._8_4_;
          auVar233._12_4_ = uVar23 ^ auVar98._12_4_;
          auVar201 = vpcmpgtq_avx(auVar233,auVar201);
          auVar201 = vpackssdw_avx(auVar201,auVar88);
          auVar110 = vblendvps_avx(auVar136,auVar110,auVar58 ^ auVar201);
          auVar201 = vblendvps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,auVar58 ^ auVar59);
          auVar110 = vhaddps_avx(auVar201,auVar110);
          auVar110 = vhaddps_avx(auVar110,auVar110);
          auVar110 = vhaddps_avx(auVar110,auVar110);
        }
        auVar64._0_4_ = auVar244._0_4_ + auVar244._16_4_ + auVar164._0_4_;
        auVar64._4_4_ = auVar244._4_4_ + auVar244._20_4_ + auVar164._4_4_;
        auVar64._8_4_ = auVar244._8_4_ + auVar244._24_4_ + auVar164._8_4_;
        auVar64._12_4_ = auVar244._12_4_ + auVar244._28_4_ + auVar164._12_4_;
        auVar164 = vhaddps_avx(auVar64,auVar64);
        auVar164 = vhaddps_avx(auVar164,auVar164);
        fVar108 = auVar164._0_4_ + auVar110._0_4_;
        auVar110 = ZEXT416((uint)fVar108);
        auVar164 = auVar250._0_16_;
        fVar71 = fVar108;
        switch(uVar33) {
        case 1:
          auVar110 = vmaxss_avx(auVar110,ZEXT416(0));
          fVar71 = auVar110._0_4_;
          break;
        case 2:
          auVar110 = vcmpss_avx(ZEXT816(0) << 0x20,auVar110,1);
          auVar139._8_4_ = 0x3f800000;
          auVar139._0_8_ = 0x3f8000003f800000;
          auVar139._12_4_ = 0x3f800000;
          auVar110 = vblendvps_avx(ZEXT416((uint)*pfVar22),auVar139,auVar110);
          fVar71 = auVar110._0_4_ * fVar108;
          break;
        case 3:
          auVar110 = vmaxss_avx(auVar110,ZEXT416((uint)*pfVar22));
          fVar71 = auVar110._0_4_;
          if (pfVar22[1] < auVar110._0_4_) {
            fVar71 = pfVar22[1];
          }
          break;
        case 4:
          auVar110 = vminss_avx(auVar110,ZEXT416(0x42b0c0a5));
          auVar89._0_8_ = auVar110._0_8_ ^ 0x8000000080000000;
          auVar89._8_4_ = auVar110._8_4_ ^ 0x80000000;
          auVar89._12_4_ = auVar110._12_4_ ^ 0x80000000;
          auVar110 = vcmpss_avx(auVar110,ZEXT416(0xc2b0c0a5),1);
          auVar138._8_4_ = 0x42b0c0a5;
          auVar138._0_8_ = 0x42b0c0a542b0c0a5;
          auVar138._12_4_ = 0x42b0c0a5;
          auVar110 = vblendvps_avx(auVar89,auVar138,auVar110);
          fVar108 = expf(auVar110._0_4_);
          auVar110 = vpcmpeqd_avx(auVar164,auVar164);
          auVar250 = ZEXT1664(auVar110);
          auVar195 = ZEXT1664(local_e8);
          auVar162 = ZEXT3264(_DAT_005f2920);
          auVar106 = ZEXT3264(_DAT_005f2900);
          fVar71 = 1.0 / (fVar108 + 1.0);
          break;
        case 5:
          fVar71 = expf(fVar108);
          fVar71 = logf(fVar71 + 1.0);
          fVar71 = tanhf(fVar71);
          auVar110 = vpcmpeqd_avx(auVar164,auVar164);
          auVar250 = ZEXT1664(auVar110);
          auVar195 = ZEXT1664(local_e8);
          auVar162 = ZEXT3264(_DAT_005f2920);
          auVar106 = ZEXT3264(_DAT_005f2900);
          fVar71 = fVar71 * fVar108;
          break;
        case 6:
          fVar302 = *pfVar22;
          fVar163 = -pfVar22[1] / fVar302;
          fVar71 = 0.0;
          if ((fVar163 <= fVar108) && (fVar71 = fVar108, fVar108 <= fVar163 + 1.0 / fVar302)) {
            auVar110 = vfmadd213ss_fma(ZEXT416((uint)fVar302),auVar110,ZEXT416((uint)pfVar22[1]));
            fVar71 = auVar110._0_4_ * fVar108;
          }
        }
        *(float *)((long)pvVar21 + uVar36 * 4) = fVar71;
        uVar36 = uVar36 + 1;
      } while (uVar36 != local_d8);
    }
    else if (iVar30 == 4) {
      if (0 < (int)uVar35) {
        uVar36 = 0;
        auVar227._8_4_ = 0x3f000000;
        auVar227._0_8_ = 0x3f0000003f000000;
        auVar227._12_4_ = 0x3f000000;
        auVar250 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        auVar357._8_4_ = 0x3ab743ce;
        auVar357._0_8_ = 0x3ab743ce3ab743ce;
        auVar357._12_4_ = 0x3ab743ce;
        auVar304._8_4_ = 0x3c088908;
        auVar304._0_8_ = 0x3c0889083c088908;
        auVar304._12_4_ = 0x3c088908;
        auVar251._8_4_ = 0x3d2aa9c1;
        auVar251._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar251._12_4_ = 0x3d2aa9c1;
        do {
          auVar110 = ZEXT816(0) << 0x40;
          if (pvVar19 != (void *)0x0) {
            auVar110 = *(undefined1 (*) [16])((long)pvVar19 + uVar36 * 0x10);
          }
          pauVar44 = (undefined1 (*) [32])
                     ((long)(this->weight_data_tm).w * uVar36 * (this->weight_data_tm).elemsize +
                     (long)(this->weight_data_tm).data);
          pauVar32 = local_138;
          if ((int)uVar51 < 8) {
            auVar98 = SUB6432(ZEXT864(0),0);
            auVar244 = SUB6432(ZEXT864(0),0);
            auVar162 = ZEXT864(0);
            auVar106 = ZEXT864(0);
            uVar47 = 0;
          }
          else {
            auVar106 = ZEXT864(0);
            iVar30 = 7;
            auVar162 = ZEXT864(0);
            auVar195 = ZEXT864(0);
            auVar375 = ZEXT864(0);
            do {
              uVar7 = *(undefined4 *)*pauVar32;
              auVar221._4_4_ = uVar7;
              auVar221._0_4_ = uVar7;
              auVar221._8_4_ = uVar7;
              auVar221._12_4_ = uVar7;
              uVar7 = *(undefined4 *)(*pauVar32 + 4);
              auVar221._20_4_ = uVar7;
              auVar221._16_4_ = uVar7;
              auVar221._24_4_ = uVar7;
              auVar221._28_4_ = uVar7;
              uVar7 = *(undefined4 *)(*pauVar32 + 8);
              auVar289._4_4_ = uVar7;
              auVar289._0_4_ = uVar7;
              auVar289._8_4_ = uVar7;
              auVar289._12_4_ = uVar7;
              uVar7 = *(undefined4 *)(*pauVar32 + 0xc);
              auVar289._20_4_ = uVar7;
              auVar289._16_4_ = uVar7;
              auVar289._24_4_ = uVar7;
              auVar289._28_4_ = uVar7;
              uVar7 = *(undefined4 *)(*pauVar32 + 0x10);
              auVar339._4_4_ = uVar7;
              auVar339._0_4_ = uVar7;
              auVar339._8_4_ = uVar7;
              auVar339._12_4_ = uVar7;
              uVar7 = *(undefined4 *)(*pauVar32 + 0x14);
              auVar339._20_4_ = uVar7;
              auVar339._16_4_ = uVar7;
              auVar339._24_4_ = uVar7;
              auVar339._28_4_ = uVar7;
              uVar7 = *(undefined4 *)(*pauVar32 + 0x18);
              auVar348._4_4_ = uVar7;
              auVar348._0_4_ = uVar7;
              auVar348._8_4_ = uVar7;
              auVar348._12_4_ = uVar7;
              uVar7 = *(undefined4 *)(*pauVar32 + 0x1c);
              auVar348._20_4_ = uVar7;
              auVar348._16_4_ = uVar7;
              auVar348._24_4_ = uVar7;
              auVar348._28_4_ = uVar7;
              auVar164 = vfmadd231ps_fma(auVar106._0_32_,auVar221,*pauVar44);
              auVar106 = ZEXT1664(auVar164);
              auVar164 = vfmadd231ps_fma(auVar162._0_32_,auVar289,pauVar44[1]);
              auVar162 = ZEXT1664(auVar164);
              auVar164 = vfmadd231ps_fma(auVar195._0_32_,auVar339,pauVar44[2]);
              auVar195 = ZEXT1664(auVar164);
              auVar244 = ZEXT1632(auVar164);
              auVar164 = vfmadd231ps_fma(auVar375._0_32_,auVar348,pauVar44[3]);
              auVar375 = ZEXT1664(auVar164);
              auVar98 = ZEXT1632(auVar164);
              pauVar32 = pauVar32 + 1;
              pauVar44 = pauVar44 + 4;
              iVar30 = iVar30 + 8;
              uVar47 = uVar51 & 0xfffffff8;
            } while (iVar30 < (int)uVar51);
          }
          auVar96 = auVar106._0_32_;
          auVar67 = auVar162._0_32_;
          uVar46 = uVar47 | 3;
          while ((int)uVar46 < (int)uVar51) {
            uVar7 = *(undefined4 *)*pauVar32;
            auVar222._4_4_ = uVar7;
            auVar222._0_4_ = uVar7;
            auVar222._8_4_ = uVar7;
            auVar222._12_4_ = uVar7;
            uVar7 = *(undefined4 *)(*pauVar32 + 4);
            auVar222._20_4_ = uVar7;
            auVar222._16_4_ = uVar7;
            auVar222._24_4_ = uVar7;
            auVar222._28_4_ = uVar7;
            uVar7 = *(undefined4 *)(*pauVar32 + 8);
            auVar290._4_4_ = uVar7;
            auVar290._0_4_ = uVar7;
            auVar290._8_4_ = uVar7;
            auVar290._12_4_ = uVar7;
            uVar7 = *(undefined4 *)(*pauVar32 + 0xc);
            auVar290._20_4_ = uVar7;
            auVar290._16_4_ = uVar7;
            auVar290._24_4_ = uVar7;
            auVar290._28_4_ = uVar7;
            auVar164 = vfmadd231ps_fma(auVar106._0_32_,auVar222,*pauVar44);
            auVar106 = ZEXT1664(auVar164);
            auVar96 = ZEXT1632(auVar164);
            auVar164 = vfmadd231ps_fma(auVar162._0_32_,auVar290,pauVar44[1]);
            auVar162 = ZEXT1664(auVar164);
            auVar67 = ZEXT1632(auVar164);
            pauVar32 = (undefined1 (*) [32])(*pauVar32 + 0x10);
            pauVar44 = pauVar44 + 2;
            uVar46 = uVar47 + 7;
            uVar47 = uVar47 + 4;
          }
          if (uVar51 - uVar47 != 0 && (int)uVar47 <= (int)uVar51) {
            lVar45 = 0;
            do {
              uVar7 = *(undefined4 *)(*pauVar32 + lVar45 * 4);
              auVar197._4_4_ = uVar7;
              auVar197._0_4_ = uVar7;
              auVar197._8_4_ = uVar7;
              auVar197._12_4_ = uVar7;
              auVar110 = vfmadd231ps_fma(auVar110,auVar197,*(undefined1 (*) [16])*pauVar44);
              pauVar44 = (undefined1 (*) [32])(*pauVar44 + 0x10);
              lVar45 = lVar45 + 1;
            } while (uVar51 - uVar47 != (int)lVar45);
          }
          fVar108 = auVar98._4_4_ + auVar244._4_4_ + auVar67._4_4_ + auVar96._4_4_;
          auVar74._0_4_ =
               auVar110._0_4_ +
               auVar98._16_4_ + auVar244._16_4_ + auVar67._16_4_ + auVar96._16_4_ +
               auVar98._0_4_ + auVar244._0_4_ + auVar67._0_4_ + auVar96._0_4_;
          auVar74._4_4_ = auVar110._4_4_ + fVar108 + fVar108;
          auVar74._8_4_ =
               auVar110._8_4_ +
               auVar98._24_4_ + auVar244._24_4_ + auVar67._24_4_ + auVar96._24_4_ +
               auVar98._8_4_ + auVar244._8_4_ + auVar67._8_4_ + auVar96._8_4_;
          auVar74._12_4_ =
               auVar110._12_4_ +
               auVar98._28_4_ + auVar244._28_4_ + auVar67._28_4_ + auVar96._28_4_ +
               auVar98._12_4_ + auVar244._12_4_ + auVar67._12_4_ + auVar96._12_4_;
          auVar110 = auVar250._0_16_;
          fVar108 = auVar250._0_4_;
          fVar71 = auVar250._4_4_;
          fVar302 = auVar250._8_4_;
          fVar163 = auVar250._12_4_;
          switch(uVar33) {
          case 1:
            auVar74 = vmaxps_avx(auVar74,_DAT_005f1060);
            break;
          case 2:
            auVar110 = vmaxps_avx(auVar74,ZEXT816(0) << 0x40);
            auVar164 = vminps_avx(auVar74,ZEXT816(0) << 0x40);
            uVar7 = *(this->super_InnerProduct).activation_params.data;
            auVar77._4_4_ = uVar7;
            auVar77._0_4_ = uVar7;
            auVar77._8_4_ = uVar7;
            auVar77._12_4_ = uVar7;
            auVar74 = vfmadd213ps_fma(auVar77,auVar164,auVar110);
            break;
          case 3:
            puVar20 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar7 = *puVar20;
            auVar114._4_4_ = uVar7;
            auVar114._0_4_ = uVar7;
            auVar114._8_4_ = uVar7;
            auVar114._12_4_ = uVar7;
            uVar7 = puVar20[1];
            auVar170._4_4_ = uVar7;
            auVar170._0_4_ = uVar7;
            auVar170._8_4_ = uVar7;
            auVar170._12_4_ = uVar7;
            auVar110 = vmaxps_avx(auVar74,auVar114);
            auVar74 = vminps_avx(auVar110,auVar170);
            break;
          case 4:
            uVar42 = CONCAT44(auVar74._4_4_,auVar74._0_4_);
            auVar75._0_8_ = uVar42 ^ 0x8000000080000000;
            auVar75._8_4_ = -auVar74._8_4_;
            auVar75._12_4_ = -auVar74._12_4_;
            auVar115._8_4_ = 0x42b0c0a5;
            auVar115._0_8_ = 0x42b0c0a542b0c0a5;
            auVar115._12_4_ = 0x42b0c0a5;
            auVar164 = vminps_avx(auVar75,auVar115);
            auVar116._8_4_ = 0xc2b0c0a5;
            auVar116._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar116._12_4_ = 0xc2b0c0a5;
            auVar59 = vmaxps_avx(auVar164,auVar116);
            auVar117._8_4_ = 0x3fb8aa3b;
            auVar117._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar117._12_4_ = 0x3fb8aa3b;
            auVar164 = vfmadd213ps_fma(auVar117,auVar59,auVar227);
            auVar171._0_4_ = (int)auVar164._0_4_;
            auVar171._4_4_ = (int)auVar164._4_4_;
            auVar171._8_4_ = (int)auVar164._8_4_;
            auVar171._12_4_ = (int)auVar164._12_4_;
            auVar201 = vcvtdq2ps_avx(auVar171);
            auVar164 = vcmpps_avx(auVar164,auVar201,1);
            auVar164 = vandps_avx(auVar164,auVar110);
            auVar164 = vsubps_avx(auVar201,auVar164);
            auVar55._8_4_ = 0x3f318000;
            auVar55._0_8_ = 0x3f3180003f318000;
            auVar55._12_4_ = 0x3f318000;
            auVar201 = vfmsub231ps_fma(auVar59,auVar164,auVar55);
            auVar172._8_4_ = 0x395e8083;
            auVar172._0_8_ = 0x395e8083395e8083;
            auVar172._12_4_ = 0x395e8083;
            auVar59 = vfmsub231ps_fma(auVar201,auVar164,auVar172);
            auVar173._0_4_ = auVar59._0_4_ * auVar59._0_4_;
            auVar173._4_4_ = auVar59._4_4_ * auVar59._4_4_;
            auVar173._8_4_ = auVar59._8_4_ * auVar59._8_4_;
            auVar173._12_4_ = auVar59._12_4_ * auVar59._12_4_;
            auVar205._8_4_ = 0x39506967;
            auVar205._0_8_ = 0x3950696739506967;
            auVar205._12_4_ = 0x39506967;
            auVar270._8_4_ = 0x3ab743ce;
            auVar270._0_8_ = 0x3ab743ce3ab743ce;
            auVar270._12_4_ = 0x3ab743ce;
            auVar201 = vfmadd213ps_fma(auVar205,auVar59,auVar270);
            auVar271._8_4_ = 0x3c088908;
            auVar271._0_8_ = 0x3c0889083c088908;
            auVar271._12_4_ = 0x3c088908;
            auVar201 = vfmadd213ps_fma(auVar201,auVar59,auVar271);
            auVar56._8_4_ = 0x3d2aa9c1;
            auVar56._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar56._12_4_ = 0x3d2aa9c1;
            auVar201 = vfmadd213ps_fma(auVar201,auVar59,auVar56);
            auVar57._8_4_ = 0x3e2aaaaa;
            auVar57._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar57._12_4_ = 0x3e2aaaaa;
            auVar201 = vfmadd213ps_fma(auVar201,auVar59,auVar57);
            auVar201 = vfmadd213ps_fma(auVar201,auVar59,auVar227);
            auVar201 = vfmadd213ps_fma(auVar201,auVar173,auVar59);
            auVar76._0_4_ = auVar201._0_4_ + fVar108;
            auVar76._4_4_ = auVar201._4_4_ + fVar71;
            auVar76._8_4_ = auVar201._8_4_ + fVar302;
            auVar76._12_4_ = auVar201._12_4_ + fVar163;
            auVar118._0_4_ = (int)auVar164._0_4_;
            auVar118._4_4_ = (int)auVar164._4_4_;
            auVar118._8_4_ = (int)auVar164._8_4_;
            auVar118._12_4_ = (int)auVar164._12_4_;
            auVar164 = vpslld_avx(auVar118,0x17);
            auVar164 = vpaddd_avx(auVar164,auVar110);
            auVar164 = vfmadd213ps_fma(auVar164,auVar76,auVar110);
            auVar74 = vdivps_avx(auVar110,auVar164);
            break;
          case 5:
            auVar344._8_4_ = 0x42b0c0a5;
            auVar344._0_8_ = 0x42b0c0a542b0c0a5;
            auVar344._12_4_ = 0x42b0c0a5;
            auVar164 = vminps_avx(auVar344,auVar74);
            auVar351._8_4_ = 0xc2b0c0a5;
            auVar351._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar351._12_4_ = 0xc2b0c0a5;
            auVar59 = vmaxps_avx(auVar351,auVar164);
            auVar368._8_4_ = 0x3fb8aa3b;
            auVar368._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar368._12_4_ = 0x3fb8aa3b;
            auVar164 = vfmadd213ps_fma(auVar368,auVar59,auVar227);
            auVar198._0_4_ = (int)auVar164._0_4_;
            auVar198._4_4_ = (int)auVar164._4_4_;
            auVar198._8_4_ = (int)auVar164._8_4_;
            auVar198._12_4_ = (int)auVar164._12_4_;
            auVar201 = vcvtdq2ps_avx(auVar198);
            auVar164 = vcmpps_avx(auVar164,auVar201,1);
            auVar164 = vandps_avx(auVar164,auVar110);
            auVar164 = vsubps_avx(auVar201,auVar164);
            auVar345._8_4_ = 0x3f318000;
            auVar345._0_8_ = 0x3f3180003f318000;
            auVar345._12_4_ = 0x3f318000;
            auVar201 = vfmsub231ps_fma(auVar59,auVar164,auVar345);
            auVar239._8_4_ = 0xb95e8083;
            auVar239._0_8_ = 0xb95e8083b95e8083;
            auVar239._12_4_ = 0xb95e8083;
            auVar59 = vfnmsub231ps_fma(auVar201,auVar164,auVar239);
            auVar199._0_4_ = auVar59._0_4_ * auVar59._0_4_;
            auVar199._4_4_ = auVar59._4_4_ * auVar59._4_4_;
            auVar199._8_4_ = auVar59._8_4_ * auVar59._8_4_;
            auVar199._12_4_ = auVar59._12_4_ * auVar59._12_4_;
            auVar264._8_4_ = 0x39506967;
            auVar264._0_8_ = 0x3950696739506967;
            auVar264._12_4_ = 0x39506967;
            auVar201 = vfmadd213ps_fma(auVar264,auVar59,auVar357);
            auVar201 = vfmadd213ps_fma(auVar201,auVar59,auVar304);
            auVar201 = vfmadd213ps_fma(auVar201,auVar59,auVar251);
            auVar281._8_4_ = 0x3e2aaaaa;
            auVar281._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar281._12_4_ = 0x3e2aaaaa;
            auVar201 = vfmadd213ps_fma(auVar201,auVar59,auVar281);
            auVar201 = vfmadd213ps_fma(auVar201,auVar59,auVar227);
            auVar201 = vfmadd213ps_fma(auVar201,auVar199,auVar59);
            auVar200._0_4_ = auVar201._0_4_ + fVar108;
            auVar200._4_4_ = auVar201._4_4_ + fVar71;
            auVar200._8_4_ = auVar201._8_4_ + fVar302;
            auVar200._12_4_ = auVar201._12_4_ + fVar163;
            auVar112._0_4_ = (int)auVar164._0_4_;
            auVar112._4_4_ = (int)auVar164._4_4_;
            auVar112._8_4_ = (int)auVar164._8_4_;
            auVar112._12_4_ = (int)auVar164._12_4_;
            auVar164 = vpslld_avx(auVar112,0x17);
            auVar164 = vpaddd_avx(auVar164,auVar110);
            auVar78 = vfmadd213ps_fma(auVar164,auVar200,auVar110);
            auVar165._8_4_ = 0x800000;
            auVar165._0_8_ = 0x80000000800000;
            auVar165._12_4_ = 0x800000;
            auVar164 = vmaxps_avx(auVar78,auVar165);
            auVar201 = vpsrld_avx(auVar164,0x17);
            auVar265._8_4_ = 0xffffff82;
            auVar265._0_8_ = 0xffffff82ffffff82;
            auVar265._12_4_ = 0xffffff82;
            auVar201 = vpaddd_avx(auVar265,auVar201);
            auVar266._8_4_ = 0x807fffff;
            auVar266._0_8_ = 0x807fffff807fffff;
            auVar266._12_4_ = 0x807fffff;
            auVar164 = vandps_avx(auVar266,auVar164);
            auVar359 = vorps_avx(auVar164,auVar227);
            auVar59 = vcvtdq2ps_avx(auVar201);
            auVar267._8_4_ = 0x3f3504f3;
            auVar267._0_8_ = 0x3f3504f33f3504f3;
            auVar267._12_4_ = 0x3f3504f3;
            auVar201 = vcmpps_avx(auVar359,auVar267,1);
            auVar164 = vandps_avx(auVar201,auVar359);
            auVar166._0_4_ = auVar164._0_4_ + auVar359._0_4_ + -1.0;
            auVar166._4_4_ = auVar164._4_4_ + auVar359._4_4_ + -1.0;
            auVar166._8_4_ = auVar164._8_4_ + auVar359._8_4_ + -1.0;
            auVar166._12_4_ = auVar164._12_4_ + auVar359._12_4_ + -1.0;
            auVar164 = vandps_avx(auVar201,auVar110);
            auVar201 = vsubps_avx(auVar59,auVar164);
            auVar268._0_4_ = auVar166._0_4_ * auVar166._0_4_;
            auVar268._4_4_ = auVar166._4_4_ * auVar166._4_4_;
            auVar268._8_4_ = auVar166._8_4_ * auVar166._8_4_;
            auVar268._12_4_ = auVar166._12_4_ * auVar166._12_4_;
            auVar282._8_4_ = 0x3d9021bb;
            auVar282._0_8_ = 0x3d9021bb3d9021bb;
            auVar282._12_4_ = 0x3d9021bb;
            auVar326._8_4_ = 0xbdebd1b8;
            auVar326._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar326._12_4_ = 0xbdebd1b8;
            auVar164 = vfmadd213ps_fma(auVar282,auVar166,auVar326);
            auVar327._8_4_ = 0x3def251a;
            auVar327._0_8_ = 0x3def251a3def251a;
            auVar327._12_4_ = 0x3def251a;
            auVar164 = vfmadd213ps_fma(auVar164,auVar166,auVar327);
            auVar328._8_4_ = 0xbdfe5d4f;
            auVar328._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar328._12_4_ = 0xbdfe5d4f;
            auVar164 = vfmadd213ps_fma(auVar164,auVar166,auVar328);
            auVar329._8_4_ = 0x3e11e9bf;
            auVar329._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar329._12_4_ = 0x3e11e9bf;
            auVar164 = vfmadd213ps_fma(auVar164,auVar166,auVar329);
            auVar330._8_4_ = 0xbe2aae50;
            auVar330._0_8_ = 0xbe2aae50be2aae50;
            auVar330._12_4_ = 0xbe2aae50;
            auVar164 = vfmadd213ps_fma(auVar164,auVar166,auVar330);
            auVar331._8_4_ = 0x3e4cceac;
            auVar331._0_8_ = 0x3e4cceac3e4cceac;
            auVar331._12_4_ = 0x3e4cceac;
            auVar164 = vfmadd213ps_fma(auVar164,auVar166,auVar331);
            auVar332._8_4_ = 0xbe7ffffc;
            auVar332._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar332._12_4_ = 0xbe7ffffc;
            auVar164 = vfmadd213ps_fma(auVar164,auVar166,auVar332);
            auVar333._8_4_ = 0x3eaaaaaa;
            auVar333._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar333._12_4_ = 0x3eaaaaaa;
            auVar164 = vfmadd213ps_fma(auVar164,auVar166,auVar333);
            auVar283._0_4_ = auVar268._0_4_ * auVar166._0_4_ * auVar164._0_4_;
            auVar283._4_4_ = auVar268._4_4_ * auVar166._4_4_ * auVar164._4_4_;
            auVar283._8_4_ = auVar268._8_4_ * auVar166._8_4_ * auVar164._8_4_;
            auVar283._12_4_ = auVar268._12_4_ * auVar166._12_4_ * auVar164._12_4_;
            auVar164 = vfmadd231ps_fma(auVar283,auVar201,auVar239);
            auVar59 = vfmsub231ps_fma(auVar164,auVar227,auVar268);
            auVar164 = vcmpps_avx(auVar78,_DAT_005f1060,2);
            auVar59 = vsubps_avx(auVar59,auVar166);
            auVar201 = vfnmadd231ps_fma(auVar59,auVar345,auVar201);
            auVar167._0_4_ = auVar201._0_4_ + auVar201._0_4_;
            auVar167._4_4_ = auVar201._4_4_ + auVar201._4_4_;
            auVar167._8_4_ = auVar201._8_4_ + auVar201._8_4_;
            auVar167._12_4_ = auVar201._12_4_ + auVar201._12_4_;
            auVar202._8_4_ = 0x7fffffff;
            auVar202._0_8_ = 0x7fffffff7fffffff;
            auVar202._12_4_ = 0x7fffffff;
            auVar164 = vblendvps_avx(auVar167,auVar202,auVar164);
            auVar168._8_4_ = 0x42b0c0a5;
            auVar168._0_8_ = 0x42b0c0a542b0c0a5;
            auVar168._12_4_ = 0x42b0c0a5;
            auVar164 = vminps_avx(auVar164,auVar168);
            auVar59 = vmaxps_avx(auVar351,auVar164);
            auVar164 = vfmadd213ps_fma(auVar368,auVar59,auVar227);
            auVar203._0_4_ = (int)auVar164._0_4_;
            auVar203._4_4_ = (int)auVar164._4_4_;
            auVar203._8_4_ = (int)auVar164._8_4_;
            auVar203._12_4_ = (int)auVar164._12_4_;
            auVar201 = vcvtdq2ps_avx(auVar203);
            auVar164 = vcmpps_avx(auVar164,auVar201,1);
            auVar164 = vandps_avx(auVar164,auVar110);
            auVar164 = vsubps_avx(auVar201,auVar164);
            auVar201 = vfmsub231ps_fma(auVar59,auVar164,auVar345);
            auVar59 = vfnmsub231ps_fma(auVar201,auVar164,auVar239);
            auVar250 = ZEXT1664(auVar110);
            auVar204._0_4_ = auVar59._0_4_ * auVar59._0_4_;
            auVar204._4_4_ = auVar59._4_4_ * auVar59._4_4_;
            auVar204._8_4_ = auVar59._8_4_ * auVar59._8_4_;
            auVar204._12_4_ = auVar59._12_4_ * auVar59._12_4_;
            auVar269._8_4_ = 0x39506967;
            auVar269._0_8_ = 0x3950696739506967;
            auVar269._12_4_ = 0x39506967;
            auVar201 = vfmadd213ps_fma(auVar269,auVar59,auVar357);
            auVar201 = vfmadd213ps_fma(auVar201,auVar59,auVar304);
            auVar201 = vfmadd213ps_fma(auVar201,auVar59,auVar251);
            auVar53._8_4_ = 0x3e2aaaaa;
            auVar53._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar53._12_4_ = 0x3e2aaaaa;
            auVar201 = vfmadd213ps_fma(auVar201,auVar59,auVar53);
            auVar201 = vfmadd213ps_fma(auVar201,auVar59,auVar227);
            auVar201 = vfmadd213ps_fma(auVar201,auVar204,auVar59);
            auVar113._0_4_ = auVar201._0_4_ + fVar108;
            auVar113._4_4_ = auVar201._4_4_ + fVar71;
            auVar113._8_4_ = auVar201._8_4_ + fVar302;
            auVar113._12_4_ = auVar201._12_4_ + fVar163;
            auVar169._0_4_ = (int)auVar164._0_4_;
            auVar169._4_4_ = (int)auVar164._4_4_;
            auVar169._8_4_ = (int)auVar164._8_4_;
            auVar169._12_4_ = (int)auVar164._12_4_;
            auVar164 = vpslld_avx(auVar169,0x17);
            auVar164 = vpaddd_avx(auVar164,auVar110);
            auVar110 = vfmadd213ps_fma(auVar164,auVar113,auVar110);
            auVar54._8_4_ = 0x40000000;
            auVar54._0_8_ = 0x4000000040000000;
            auVar54._12_4_ = 0x40000000;
            auVar110 = vdivps_avx(auVar54,auVar110);
            auVar74 = vfmsub231ps_fma(auVar74,auVar74,auVar110);
            break;
          case 6:
            puVar20 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar7 = *puVar20;
            auVar119._4_4_ = uVar7;
            auVar119._0_4_ = uVar7;
            auVar119._8_4_ = uVar7;
            auVar119._12_4_ = uVar7;
            uVar7 = puVar20[1];
            auVar174._4_4_ = uVar7;
            auVar174._0_4_ = uVar7;
            auVar174._8_4_ = uVar7;
            auVar174._12_4_ = uVar7;
            auVar164 = vfmadd231ps_fma(auVar174,auVar74,auVar119);
            auVar164 = vmaxps_avx(auVar164,_DAT_005f1060);
            auVar110 = vminps_avx(auVar164,auVar110);
            auVar74._0_4_ = auVar110._0_4_ * auVar74._0_4_;
            auVar74._4_4_ = auVar110._4_4_ * auVar74._4_4_;
            auVar74._8_4_ = auVar110._8_4_ * auVar74._8_4_;
            auVar74._12_4_ = auVar110._12_4_ * auVar74._12_4_;
          }
          *(undefined1 (*) [16])((long)top_blob->data + uVar36 * 0x10) = auVar74;
          uVar36 = uVar36 + 1;
        } while (uVar36 != uVar35);
      }
    }
    else if ((iVar30 == 8) && (0 < (int)uVar35)) {
      uVar36 = 0;
      auVar274._8_4_ = 0x3f000000;
      auVar274._0_8_ = 0x3f0000003f000000;
      auVar274._12_4_ = 0x3f000000;
      auVar274._16_4_ = 0x3f000000;
      auVar274._20_4_ = 0x3f000000;
      auVar274._24_4_ = 0x3f000000;
      auVar274._28_4_ = 0x3f000000;
      auVar250 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      do {
        auVar106 = ZEXT1664(ZEXT816(0) << 0x40);
        if (pvVar19 != (void *)0x0) {
          auVar106 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar19 + uVar36 * 0x20));
        }
        pauVar44 = (undefined1 (*) [32])
                   ((long)(this->weight_data_tm).w * uVar36 * (this->weight_data_tm).elemsize +
                   (long)(this->weight_data_tm).data);
        pauVar32 = local_138;
        if ((int)uVar51 < 8) {
          auVar98 = SUB6432(ZEXT864(0),0);
          auVar96 = SUB6432(ZEXT864(0),0);
          auVar244 = SUB6432(ZEXT864(0),0);
          auVar67 = SUB6432(ZEXT864(0),0);
          auVar162 = ZEXT864(0);
          auVar195 = ZEXT864(0);
          auVar375 = ZEXT864(0);
          uVar47 = 0;
        }
        else {
          auVar375 = ZEXT864(0);
          iVar30 = 7;
          auVar195 = ZEXT864(0);
          auVar162 = ZEXT864(0);
          auVar343 = ZEXT864(0);
          auVar238 = ZEXT864(0);
          auVar350 = ZEXT864(0);
          auVar301 = ZEXT864(0);
          do {
            uVar7 = *(undefined4 *)*pauVar32;
            auVar352._4_4_ = uVar7;
            auVar352._0_4_ = uVar7;
            auVar352._8_4_ = uVar7;
            auVar352._12_4_ = uVar7;
            auVar352._16_4_ = uVar7;
            auVar352._20_4_ = uVar7;
            auVar352._24_4_ = uVar7;
            auVar352._28_4_ = uVar7;
            uVar7 = *(undefined4 *)(*pauVar32 + 4);
            auVar362._4_4_ = uVar7;
            auVar362._0_4_ = uVar7;
            auVar362._8_4_ = uVar7;
            auVar362._12_4_ = uVar7;
            auVar362._16_4_ = uVar7;
            auVar362._20_4_ = uVar7;
            auVar362._24_4_ = uVar7;
            auVar362._28_4_ = uVar7;
            uVar7 = *(undefined4 *)(*pauVar32 + 8);
            auVar308._4_4_ = uVar7;
            auVar308._0_4_ = uVar7;
            auVar308._8_4_ = uVar7;
            auVar308._12_4_ = uVar7;
            auVar308._16_4_ = uVar7;
            auVar308._20_4_ = uVar7;
            auVar308._24_4_ = uVar7;
            auVar308._28_4_ = uVar7;
            uVar7 = *(undefined4 *)(*pauVar32 + 0xc);
            auVar253._4_4_ = uVar7;
            auVar253._0_4_ = uVar7;
            auVar253._8_4_ = uVar7;
            auVar253._12_4_ = uVar7;
            auVar253._16_4_ = uVar7;
            auVar253._20_4_ = uVar7;
            auVar253._24_4_ = uVar7;
            auVar253._28_4_ = uVar7;
            auVar110 = vfmadd231ps_fma(auVar106._0_32_,auVar352,*pauVar44);
            auVar106 = ZEXT1664(auVar110);
            auVar110 = vfmadd231ps_fma(auVar375._0_32_,auVar362,pauVar44[1]);
            auVar375 = ZEXT1664(auVar110);
            auVar110 = vfmadd231ps_fma(auVar195._0_32_,auVar308,pauVar44[2]);
            auVar195 = ZEXT1664(auVar110);
            auVar110 = vfmadd231ps_fma(auVar162._0_32_,auVar253,pauVar44[3]);
            auVar162 = ZEXT1664(auVar110);
            uVar7 = *(undefined4 *)(*pauVar32 + 0x10);
            auVar254._4_4_ = uVar7;
            auVar254._0_4_ = uVar7;
            auVar254._8_4_ = uVar7;
            auVar254._12_4_ = uVar7;
            auVar254._16_4_ = uVar7;
            auVar254._20_4_ = uVar7;
            auVar254._24_4_ = uVar7;
            auVar254._28_4_ = uVar7;
            uVar7 = *(undefined4 *)(*pauVar32 + 0x14);
            auVar309._4_4_ = uVar7;
            auVar309._0_4_ = uVar7;
            auVar309._8_4_ = uVar7;
            auVar309._12_4_ = uVar7;
            auVar309._16_4_ = uVar7;
            auVar309._20_4_ = uVar7;
            auVar309._24_4_ = uVar7;
            auVar309._28_4_ = uVar7;
            uVar7 = *(undefined4 *)(*pauVar32 + 0x18);
            auVar353._4_4_ = uVar7;
            auVar353._0_4_ = uVar7;
            auVar353._8_4_ = uVar7;
            auVar353._12_4_ = uVar7;
            auVar353._16_4_ = uVar7;
            auVar353._20_4_ = uVar7;
            auVar353._24_4_ = uVar7;
            auVar353._28_4_ = uVar7;
            uVar7 = *(undefined4 *)(*pauVar32 + 0x1c);
            auVar363._4_4_ = uVar7;
            auVar363._0_4_ = uVar7;
            auVar363._8_4_ = uVar7;
            auVar363._12_4_ = uVar7;
            auVar363._16_4_ = uVar7;
            auVar363._20_4_ = uVar7;
            auVar363._24_4_ = uVar7;
            auVar363._28_4_ = uVar7;
            auVar110 = vfmadd231ps_fma(auVar343._0_32_,auVar254,pauVar44[4]);
            auVar343 = ZEXT1664(auVar110);
            auVar67 = ZEXT1632(auVar110);
            auVar110 = vfmadd231ps_fma(auVar238._0_32_,auVar309,pauVar44[5]);
            auVar238 = ZEXT1664(auVar110);
            auVar244 = ZEXT1632(auVar110);
            auVar110 = vfmadd231ps_fma(auVar350._0_32_,auVar353,pauVar44[6]);
            auVar350 = ZEXT1664(auVar110);
            auVar96 = ZEXT1632(auVar110);
            auVar110 = vfmadd231ps_fma(auVar301._0_32_,auVar363,pauVar44[7]);
            auVar301 = ZEXT1664(auVar110);
            auVar98 = ZEXT1632(auVar110);
            pauVar32 = pauVar32 + 1;
            pauVar44 = pauVar44 + 8;
            iVar30 = iVar30 + 8;
            uVar47 = uVar51 & 0xfffffff8;
          } while (iVar30 < (int)uVar51);
        }
        auVar246 = auVar195._0_32_;
        auVar366 = auVar375._0_32_;
        auVar161 = auVar162._0_32_;
        uVar46 = uVar47 | 3;
        while (auVar291 = auVar106._0_32_, (int)uVar46 < (int)uVar51) {
          uVar7 = *(undefined4 *)*pauVar32;
          auVar255._4_4_ = uVar7;
          auVar255._0_4_ = uVar7;
          auVar255._8_4_ = uVar7;
          auVar255._12_4_ = uVar7;
          auVar255._16_4_ = uVar7;
          auVar255._20_4_ = uVar7;
          auVar255._24_4_ = uVar7;
          auVar255._28_4_ = uVar7;
          uVar7 = *(undefined4 *)(*pauVar32 + 4);
          auVar310._4_4_ = uVar7;
          auVar310._0_4_ = uVar7;
          auVar310._8_4_ = uVar7;
          auVar310._12_4_ = uVar7;
          auVar310._16_4_ = uVar7;
          auVar310._20_4_ = uVar7;
          auVar310._24_4_ = uVar7;
          auVar310._28_4_ = uVar7;
          uVar7 = *(undefined4 *)(*pauVar32 + 8);
          auVar354._4_4_ = uVar7;
          auVar354._0_4_ = uVar7;
          auVar354._8_4_ = uVar7;
          auVar354._12_4_ = uVar7;
          auVar354._16_4_ = uVar7;
          auVar354._20_4_ = uVar7;
          auVar354._24_4_ = uVar7;
          auVar354._28_4_ = uVar7;
          uVar7 = *(undefined4 *)(*pauVar32 + 0xc);
          auVar364._4_4_ = uVar7;
          auVar364._0_4_ = uVar7;
          auVar364._8_4_ = uVar7;
          auVar364._12_4_ = uVar7;
          auVar364._16_4_ = uVar7;
          auVar364._20_4_ = uVar7;
          auVar364._24_4_ = uVar7;
          auVar364._28_4_ = uVar7;
          auVar110 = vfmadd231ps_fma(auVar291,auVar255,*pauVar44);
          auVar106 = ZEXT1664(auVar110);
          auVar110 = vfmadd231ps_fma(auVar375._0_32_,auVar310,pauVar44[1]);
          auVar375 = ZEXT1664(auVar110);
          auVar366 = ZEXT1632(auVar110);
          auVar110 = vfmadd231ps_fma(auVar195._0_32_,auVar354,pauVar44[2]);
          auVar195 = ZEXT1664(auVar110);
          auVar246 = ZEXT1632(auVar110);
          auVar110 = vfmadd231ps_fma(auVar162._0_32_,auVar364,pauVar44[3]);
          auVar162 = ZEXT1664(auVar110);
          auVar161 = ZEXT1632(auVar110);
          pauVar32 = (undefined1 (*) [32])(*pauVar32 + 0x10);
          pauVar44 = pauVar44 + 4;
          uVar46 = uVar47 + 7;
          uVar47 = uVar47 + 4;
        }
        if (uVar51 - uVar47 != 0 && (int)uVar47 <= (int)uVar51) {
          lVar45 = 0;
          do {
            uVar7 = *(undefined4 *)(*pauVar32 + lVar45 * 4);
            auVar256._4_4_ = uVar7;
            auVar256._0_4_ = uVar7;
            auVar256._8_4_ = uVar7;
            auVar256._12_4_ = uVar7;
            auVar256._16_4_ = uVar7;
            auVar256._20_4_ = uVar7;
            auVar256._24_4_ = uVar7;
            auVar256._28_4_ = uVar7;
            auVar110 = vfmadd231ps_fma(auVar106._0_32_,auVar256,*pauVar44);
            auVar106 = ZEXT1664(auVar110);
            auVar291 = ZEXT1632(auVar110);
            pauVar44 = pauVar44 + 1;
            lVar45 = lVar45 + 1;
          } while (uVar51 - uVar47 != (int)lVar45);
        }
        fVar72 = auVar96._0_4_ + auVar98._0_4_ + auVar67._0_4_ + auVar244._0_4_ +
                 auVar366._0_4_ + auVar161._0_4_ + auVar246._0_4_ + auVar291._0_4_;
        fVar107 = auVar96._4_4_ + auVar98._4_4_ + auVar67._4_4_ + auVar244._4_4_ +
                  auVar366._4_4_ + auVar161._4_4_ + auVar246._4_4_ + auVar291._4_4_;
        auVar91._0_8_ = CONCAT44(fVar107,fVar72);
        auVar91._8_4_ =
             auVar96._8_4_ + auVar98._8_4_ + auVar67._8_4_ + auVar244._8_4_ +
             auVar366._8_4_ + auVar161._8_4_ + auVar246._8_4_ + auVar291._8_4_;
        auVar91._12_4_ =
             auVar96._12_4_ + auVar98._12_4_ + auVar67._12_4_ + auVar244._12_4_ +
             auVar366._12_4_ + auVar161._12_4_ + auVar246._12_4_ + auVar291._12_4_;
        auVar91._16_4_ =
             auVar96._16_4_ + auVar98._16_4_ + auVar67._16_4_ + auVar244._16_4_ +
             auVar366._16_4_ + auVar161._16_4_ + auVar246._16_4_ + auVar291._16_4_;
        auVar91._20_4_ =
             auVar96._20_4_ + auVar98._20_4_ + auVar67._20_4_ + auVar244._20_4_ +
             auVar366._20_4_ + auVar161._20_4_ + auVar246._20_4_ + auVar291._20_4_;
        auVar91._24_4_ =
             auVar96._24_4_ + auVar98._24_4_ + auVar67._24_4_ + auVar244._24_4_ +
             auVar366._24_4_ + auVar161._24_4_ + auVar246._24_4_ + auVar291._24_4_;
        auVar91._28_4_ =
             auVar96._28_4_ + auVar98._28_4_ + auVar67._28_4_ + auVar244._28_4_ +
             auVar366._28_4_ + auVar161._28_4_ + auVar246._28_4_ + auVar291._28_4_;
        auVar244 = auVar250._0_32_;
        fVar108 = auVar250._0_4_;
        fVar71 = auVar250._4_4_;
        fVar302 = auVar250._8_4_;
        fVar163 = auVar250._12_4_;
        fVar322 = auVar250._16_4_;
        fVar323 = auVar250._20_4_;
        fVar324 = auVar250._24_4_;
        fVar325 = auVar250._28_4_;
        switch(uVar33) {
        case 1:
          auVar91 = vmaxps_avx(auVar91,_DAT_005f5320);
          break;
        case 2:
          auVar244 = vmaxps_avx(auVar91,ZEXT1632(ZEXT816(0) << 0x40));
          auVar98 = vminps_avx(auVar91,ZEXT1632(ZEXT816(0) << 0x40));
          uVar7 = *(this->super_InnerProduct).activation_params.data;
          auVar95._4_4_ = uVar7;
          auVar95._0_4_ = uVar7;
          auVar95._8_4_ = uVar7;
          auVar95._12_4_ = uVar7;
          auVar95._16_4_ = uVar7;
          auVar95._20_4_ = uVar7;
          auVar95._24_4_ = uVar7;
          auVar95._28_4_ = uVar7;
          auVar110 = vfmadd213ps_fma(auVar95,auVar98,auVar244);
          auVar91 = ZEXT1632(auVar110);
          break;
        case 3:
          puVar20 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar7 = *puVar20;
          auVar144._4_4_ = uVar7;
          auVar144._0_4_ = uVar7;
          auVar144._8_4_ = uVar7;
          auVar144._12_4_ = uVar7;
          auVar144._16_4_ = uVar7;
          auVar144._20_4_ = uVar7;
          auVar144._24_4_ = uVar7;
          auVar144._28_4_ = uVar7;
          uVar7 = puVar20[1];
          auVar187._4_4_ = uVar7;
          auVar187._0_4_ = uVar7;
          auVar187._8_4_ = uVar7;
          auVar187._12_4_ = uVar7;
          auVar187._16_4_ = uVar7;
          auVar187._20_4_ = uVar7;
          auVar187._24_4_ = uVar7;
          auVar187._28_4_ = uVar7;
          auVar244 = vmaxps_avx(auVar91,auVar144);
          auVar91 = vminps_avx(auVar244,auVar187);
          break;
        case 4:
          auVar92._0_8_ = auVar91._0_8_ ^ 0x8000000080000000;
          auVar92._8_4_ = -auVar91._8_4_;
          auVar92._12_4_ = -auVar91._12_4_;
          auVar92._16_4_ = -auVar91._16_4_;
          auVar92._20_4_ = -auVar91._20_4_;
          auVar92._24_4_ = -auVar91._24_4_;
          auVar92._28_4_ = -auVar91._28_4_;
          auVar145._8_4_ = 0x42b0c0a5;
          auVar145._0_8_ = 0x42b0c0a542b0c0a5;
          auVar145._12_4_ = 0x42b0c0a5;
          auVar145._16_4_ = 0x42b0c0a5;
          auVar145._20_4_ = 0x42b0c0a5;
          auVar145._24_4_ = 0x42b0c0a5;
          auVar145._28_4_ = 0x42b0c0a5;
          auVar98 = vminps_avx(auVar92,auVar145);
          auVar146._8_4_ = 0xc2b0c0a5;
          auVar146._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar146._12_4_ = 0xc2b0c0a5;
          auVar146._16_4_ = 0xc2b0c0a5;
          auVar146._20_4_ = 0xc2b0c0a5;
          auVar146._24_4_ = 0xc2b0c0a5;
          auVar146._28_4_ = 0xc2b0c0a5;
          auVar67 = vmaxps_avx(auVar98,auVar146);
          auVar147._8_4_ = 0x3fb8aa3b;
          auVar147._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar147._12_4_ = 0x3fb8aa3b;
          auVar147._16_4_ = 0x3fb8aa3b;
          auVar147._20_4_ = 0x3fb8aa3b;
          auVar147._24_4_ = 0x3fb8aa3b;
          auVar147._28_4_ = 0x3fb8aa3b;
          auVar110 = vfmadd213ps_fma(auVar147,auVar67,auVar274);
          auVar96 = vroundps_avx(ZEXT1632(auVar110),1);
          auVar98 = vcmpps_avx(ZEXT1632(auVar110),auVar96,1);
          auVar98 = vandps_avx(auVar98,auVar244);
          auVar98 = vsubps_avx(auVar96,auVar98);
          auVar188._8_4_ = 0x3f318000;
          auVar188._0_8_ = 0x3f3180003f318000;
          auVar188._12_4_ = 0x3f318000;
          auVar188._16_4_ = 0x3f318000;
          auVar188._20_4_ = 0x3f318000;
          auVar188._24_4_ = 0x3f318000;
          auVar188._28_4_ = 0x3f318000;
          auVar110 = vfmsub231ps_fma(auVar67,auVar98,auVar188);
          auVar189._8_4_ = 0x395e8083;
          auVar189._0_8_ = 0x395e8083395e8083;
          auVar189._12_4_ = 0x395e8083;
          auVar189._16_4_ = 0x395e8083;
          auVar189._20_4_ = 0x395e8083;
          auVar189._24_4_ = 0x395e8083;
          auVar189._28_4_ = 0x395e8083;
          auVar164 = vfmsub231ps_fma(ZEXT1632(auVar110),auVar98,auVar189);
          auVar67 = ZEXT1632(auVar164);
          auVar26._28_4_ = 0x395e8083;
          auVar26._0_28_ =
               ZEXT1628(CONCAT412(auVar164._12_4_ * auVar164._12_4_,
                                  CONCAT48(auVar164._8_4_ * auVar164._8_4_,
                                           CONCAT44(auVar164._4_4_ * auVar164._4_4_,
                                                    auVar164._0_4_ * auVar164._0_4_))));
          auVar237._8_4_ = 0x39506967;
          auVar237._0_8_ = 0x3950696739506967;
          auVar237._12_4_ = 0x39506967;
          auVar237._16_4_ = 0x39506967;
          auVar237._20_4_ = 0x39506967;
          auVar237._24_4_ = 0x39506967;
          auVar237._28_4_ = 0x39506967;
          auVar260._8_4_ = 0x3ab743ce;
          auVar260._0_8_ = 0x3ab743ce3ab743ce;
          auVar260._12_4_ = 0x3ab743ce;
          auVar260._16_4_ = 0x3ab743ce;
          auVar260._20_4_ = 0x3ab743ce;
          auVar260._24_4_ = 0x3ab743ce;
          auVar260._28_4_ = 0x3ab743ce;
          auVar110 = vfmadd213ps_fma(auVar237,auVar67,auVar260);
          auVar219._8_4_ = 0x3c088908;
          auVar219._0_8_ = 0x3c0889083c088908;
          auVar219._12_4_ = 0x3c088908;
          auVar219._16_4_ = 0x3c088908;
          auVar219._20_4_ = 0x3c088908;
          auVar219._24_4_ = 0x3c088908;
          auVar219._28_4_ = 0x3c088908;
          auVar110 = vfmadd213ps_fma(ZEXT1632(auVar110),auVar67,auVar219);
          auVar220._8_4_ = 0x3d2aa9c1;
          auVar220._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar220._12_4_ = 0x3d2aa9c1;
          auVar220._16_4_ = 0x3d2aa9c1;
          auVar220._20_4_ = 0x3d2aa9c1;
          auVar220._24_4_ = 0x3d2aa9c1;
          auVar220._28_4_ = 0x3d2aa9c1;
          auVar110 = vfmadd213ps_fma(ZEXT1632(auVar110),auVar67,auVar220);
          auVar65._8_4_ = 0x3e2aaaaa;
          auVar65._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar65._12_4_ = 0x3e2aaaaa;
          auVar65._16_4_ = 0x3e2aaaaa;
          auVar65._20_4_ = 0x3e2aaaaa;
          auVar65._24_4_ = 0x3e2aaaaa;
          auVar65._28_4_ = 0x3e2aaaaa;
          auVar67 = ZEXT1632(auVar164);
          auVar110 = vfmadd213ps_fma(ZEXT1632(auVar110),auVar67,auVar65);
          auVar110 = vfmadd213ps_fma(ZEXT1632(auVar110),auVar67,auVar274);
          auVar201 = vfmadd213ps_fma(ZEXT1632(auVar110),auVar26,auVar67);
          auVar73._0_4_ = (int)auVar98._0_4_;
          auVar73._4_4_ = (int)auVar98._4_4_;
          auVar73._8_4_ = (int)auVar98._8_4_;
          auVar73._12_4_ = (int)auVar98._12_4_;
          auVar93._16_4_ = (int)auVar98._16_4_;
          auVar93._0_16_ = auVar73;
          auVar93._20_4_ = (int)auVar98._20_4_;
          auVar93._24_4_ = (int)auVar98._24_4_;
          auVar93._28_4_ = (int)auVar98._28_4_;
          auVar164 = vpslld_avx(auVar73,0x17);
          auVar110 = vpslld_avx(auVar93._16_16_,0x17);
          auVar52._8_4_ = 0x3f800000;
          auVar52._0_8_ = 0x3f8000003f800000;
          auVar52._12_4_ = 0x3f800000;
          auVar110 = vpaddd_avx(auVar110,auVar52);
          auVar164 = vpaddd_avx(auVar164,auVar52);
          auVar94._16_16_ = auVar110;
          auVar94._0_16_ = auVar164;
          auVar148._0_4_ = auVar201._0_4_ + fVar108;
          auVar148._4_4_ = auVar201._4_4_ + fVar71;
          auVar148._8_4_ = auVar201._8_4_ + fVar302;
          auVar148._12_4_ = auVar201._12_4_ + fVar163;
          auVar148._16_4_ = fVar322 + 0.0;
          auVar148._20_4_ = fVar323 + 0.0;
          auVar148._24_4_ = fVar324 + 0.0;
          auVar148._28_4_ = fVar325 + 0.0;
          auVar110 = vfmadd213ps_fma(auVar94,auVar148,auVar244);
          auVar91 = vdivps_avx(auVar244,ZEXT1632(auVar110));
          break;
        case 5:
          auVar337._8_4_ = 0x42b0c0a5;
          auVar337._0_8_ = 0x42b0c0a542b0c0a5;
          auVar337._12_4_ = 0x42b0c0a5;
          auVar337._16_4_ = 0x42b0c0a5;
          auVar337._20_4_ = 0x42b0c0a5;
          auVar337._24_4_ = 0x42b0c0a5;
          auVar337._28_4_ = 0x42b0c0a5;
          auVar98 = vminps_avx(auVar337,auVar91);
          auVar346._8_4_ = 0xc2b0c0a5;
          auVar346._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar346._12_4_ = 0xc2b0c0a5;
          auVar346._16_4_ = 0xc2b0c0a5;
          auVar346._20_4_ = 0xc2b0c0a5;
          auVar346._24_4_ = 0xc2b0c0a5;
          auVar346._28_4_ = 0xc2b0c0a5;
          auVar67 = vmaxps_avx(auVar346,auVar98);
          auVar179._8_4_ = 0x3fb8aa3b;
          auVar179._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar179._12_4_ = 0x3fb8aa3b;
          auVar179._16_4_ = 0x3fb8aa3b;
          auVar179._20_4_ = 0x3fb8aa3b;
          auVar179._24_4_ = 0x3fb8aa3b;
          auVar179._28_4_ = 0x3fb8aa3b;
          auVar110 = vfmadd213ps_fma(auVar179,auVar67,auVar274);
          auVar96 = vroundps_avx(ZEXT1632(auVar110),1);
          auVar98 = vcmpps_avx(ZEXT1632(auVar110),auVar96,1);
          auVar98 = vandps_avx(auVar98,auVar244);
          auVar98 = vsubps_avx(auVar96,auVar98);
          auVar365._8_4_ = 0x3f318000;
          auVar365._0_8_ = 0x3f3180003f318000;
          auVar365._12_4_ = 0x3f318000;
          auVar365._16_4_ = 0x3f318000;
          auVar365._20_4_ = 0x3f318000;
          auVar365._24_4_ = 0x3f318000;
          auVar365._28_4_ = 0x3f318000;
          auVar110 = vfmsub231ps_fma(auVar67,auVar98,auVar365);
          auVar347._8_4_ = 0xb95e8083;
          auVar347._0_8_ = 0xb95e8083b95e8083;
          auVar347._12_4_ = 0xb95e8083;
          auVar347._16_4_ = 0xb95e8083;
          auVar347._20_4_ = 0xb95e8083;
          auVar347._24_4_ = 0xb95e8083;
          auVar347._28_4_ = 0xb95e8083;
          auVar164 = vfnmsub231ps_fma(ZEXT1632(auVar110),auVar98,auVar347);
          auVar67 = ZEXT1632(auVar164);
          auVar24._28_4_ = auVar96._28_4_;
          auVar24._0_28_ =
               ZEXT1628(CONCAT412(auVar164._12_4_ * auVar164._12_4_,
                                  CONCAT48(auVar164._8_4_ * auVar164._8_4_,
                                           CONCAT44(auVar164._4_4_ * auVar164._4_4_,
                                                    auVar164._0_4_ * auVar164._0_4_))));
          auVar257._8_4_ = 0x39506967;
          auVar257._0_8_ = 0x3950696739506967;
          auVar257._12_4_ = 0x39506967;
          auVar257._16_4_ = 0x39506967;
          auVar257._20_4_ = 0x39506967;
          auVar257._24_4_ = 0x39506967;
          auVar257._28_4_ = 0x39506967;
          auVar372._8_4_ = 0x3ab743ce;
          auVar372._0_8_ = 0x3ab743ce3ab743ce;
          auVar372._12_4_ = 0x3ab743ce;
          auVar372._16_4_ = 0x3ab743ce;
          auVar372._20_4_ = 0x3ab743ce;
          auVar372._24_4_ = 0x3ab743ce;
          auVar372._28_4_ = 0x3ab743ce;
          auVar110 = vfmadd213ps_fma(auVar257,auVar67,auVar372);
          auVar355._8_4_ = 0x3c088908;
          auVar355._0_8_ = 0x3c0889083c088908;
          auVar355._12_4_ = 0x3c088908;
          auVar355._16_4_ = 0x3c088908;
          auVar355._20_4_ = 0x3c088908;
          auVar355._24_4_ = 0x3c088908;
          auVar355._28_4_ = 0x3c088908;
          auVar110 = vfmadd213ps_fma(ZEXT1632(auVar110),auVar67,auVar355);
          auVar245._8_4_ = 0x3d2aa9c1;
          auVar245._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar245._12_4_ = 0x3d2aa9c1;
          auVar245._16_4_ = 0x3d2aa9c1;
          auVar245._20_4_ = 0x3d2aa9c1;
          auVar245._24_4_ = 0x3d2aa9c1;
          auVar245._28_4_ = 0x3d2aa9c1;
          auVar110 = vfmadd213ps_fma(ZEXT1632(auVar110),auVar67,auVar245);
          auVar373._8_4_ = 0x3e2aaaaa;
          auVar373._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar373._12_4_ = 0x3e2aaaaa;
          auVar373._16_4_ = 0x3e2aaaaa;
          auVar373._20_4_ = 0x3e2aaaaa;
          auVar373._24_4_ = 0x3e2aaaaa;
          auVar373._28_4_ = 0x3e2aaaaa;
          auVar67 = ZEXT1632(auVar164);
          auVar110 = vfmadd213ps_fma(ZEXT1632(auVar110),auVar67,auVar373);
          auVar110 = vfmadd213ps_fma(ZEXT1632(auVar110),auVar67,auVar274);
          auVar110 = vfmadd213ps_fma(ZEXT1632(auVar110),auVar24,auVar67);
          auVar234._0_4_ = auVar110._0_4_ + fVar108;
          auVar234._4_4_ = auVar110._4_4_ + fVar71;
          auVar234._8_4_ = auVar110._8_4_ + fVar302;
          auVar234._12_4_ = auVar110._12_4_ + fVar163;
          auVar234._16_4_ = fVar322 + 0.0;
          auVar234._20_4_ = fVar323 + 0.0;
          auVar234._24_4_ = fVar324 + 0.0;
          auVar234._28_4_ = fVar325 + 0.0;
          auVar109._0_4_ = (int)auVar98._0_4_;
          auVar109._4_4_ = (int)auVar98._4_4_;
          auVar109._8_4_ = (int)auVar98._8_4_;
          auVar109._12_4_ = (int)auVar98._12_4_;
          auVar140._16_4_ = (int)auVar98._16_4_;
          auVar140._0_16_ = auVar109;
          auVar140._20_4_ = (int)auVar98._20_4_;
          auVar140._24_4_ = (int)auVar98._24_4_;
          auVar140._28_4_ = (int)auVar98._28_4_;
          auVar164 = vpslld_avx(auVar109,0x17);
          auVar110 = vpslld_avx(auVar140._16_16_,0x17);
          auVar196._8_4_ = 0x3f800000;
          auVar196._0_8_ = 0x3f8000003f800000;
          auVar196._12_4_ = 0x3f800000;
          auVar110 = vpaddd_avx(auVar110,auVar196);
          auVar164 = vpaddd_avx(auVar164,auVar196);
          auVar141._16_16_ = auVar110;
          auVar141._0_16_ = auVar164;
          auVar201 = vfmadd213ps_fma(auVar141,auVar234,auVar244);
          auVar180._8_4_ = 0x800000;
          auVar180._0_8_ = 0x80000000800000;
          auVar180._12_4_ = 0x800000;
          auVar180._16_4_ = 0x800000;
          auVar180._20_4_ = 0x800000;
          auVar180._24_4_ = 0x800000;
          auVar180._28_4_ = 0x800000;
          auVar98 = vmaxps_avx(ZEXT1632(auVar201),auVar180);
          auVar164 = vpsrld_avx(auVar98._0_16_,0x17);
          auVar110 = vpsrld_avx(auVar98._16_16_,0x17);
          auVar284._8_4_ = 0x807fffff;
          auVar284._0_8_ = 0x807fffff807fffff;
          auVar284._12_4_ = 0x807fffff;
          auVar284._16_4_ = 0x807fffff;
          auVar284._20_4_ = 0x807fffff;
          auVar284._24_4_ = 0x807fffff;
          auVar284._28_4_ = 0x807fffff;
          auVar98 = vandps_avx(auVar284,auVar98);
          auVar96 = vorps_avx(auVar274,auVar98);
          auVar285._8_4_ = 0x3f3504f3;
          auVar285._0_8_ = 0x3f3504f33f3504f3;
          auVar285._12_4_ = 0x3f3504f3;
          auVar285._16_4_ = 0x3f3504f3;
          auVar285._20_4_ = 0x3f3504f3;
          auVar285._24_4_ = 0x3f3504f3;
          auVar285._28_4_ = 0x3f3504f3;
          auVar67 = vcmpps_avx(auVar285,auVar96,2);
          auVar98 = vandnps_avx(auVar67,auVar96);
          auVar338._8_4_ = 0xbf800000;
          auVar338._0_8_ = 0xbf800000bf800000;
          auVar338._12_4_ = 0xbf800000;
          auVar338._16_4_ = 0xbf800000;
          auVar338._20_4_ = 0xbf800000;
          auVar338._24_4_ = 0xbf800000;
          auVar338._28_4_ = 0xbf800000;
          auVar181._0_4_ = auVar98._0_4_ + auVar96._0_4_ + -1.0;
          auVar181._4_4_ = auVar98._4_4_ + auVar96._4_4_ + -1.0;
          auVar181._8_4_ = auVar98._8_4_ + auVar96._8_4_ + -1.0;
          auVar181._12_4_ = auVar98._12_4_ + auVar96._12_4_ + -1.0;
          auVar181._16_4_ = auVar98._16_4_ + auVar96._16_4_ + -1.0;
          auVar181._20_4_ = auVar98._20_4_ + auVar96._20_4_ + -1.0;
          auVar181._24_4_ = auVar98._24_4_ + auVar96._24_4_ + -1.0;
          auVar181._28_4_ = auVar98._28_4_ + auVar96._28_4_ + -1.0;
          auVar110 = vpsubd_avx(auVar110,auVar67._16_16_);
          auVar303._8_4_ = 0xffffff81;
          auVar303._0_8_ = 0xffffff81ffffff81;
          auVar303._12_4_ = 0xffffff81;
          auVar110 = vpaddd_avx(auVar303,auVar110);
          auVar164 = vpsubd_avx(auVar164,auVar67._0_16_);
          auVar164 = vpaddd_avx(auVar303,auVar164);
          auVar235._16_16_ = auVar110;
          auVar235._0_16_ = auVar164;
          auVar258._0_4_ = auVar181._0_4_ * auVar181._0_4_;
          auVar258._4_4_ = auVar181._4_4_ * auVar181._4_4_;
          auVar258._8_4_ = auVar181._8_4_ * auVar181._8_4_;
          auVar258._12_4_ = auVar181._12_4_ * auVar181._12_4_;
          auVar258._16_4_ = auVar181._16_4_ * auVar181._16_4_;
          auVar258._20_4_ = auVar181._20_4_ * auVar181._20_4_;
          auVar258._24_4_ = auVar181._24_4_ * auVar181._24_4_;
          auVar258._28_4_ = 0;
          auVar286._8_4_ = 0x3d9021bb;
          auVar286._0_8_ = 0x3d9021bb3d9021bb;
          auVar286._12_4_ = 0x3d9021bb;
          auVar286._16_4_ = 0x3d9021bb;
          auVar286._20_4_ = 0x3d9021bb;
          auVar286._24_4_ = 0x3d9021bb;
          auVar286._28_4_ = 0x3d9021bb;
          auVar311._8_4_ = 0xbdebd1b8;
          auVar311._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar311._12_4_ = 0xbdebd1b8;
          auVar311._16_4_ = 0xbdebd1b8;
          auVar311._20_4_ = 0xbdebd1b8;
          auVar311._24_4_ = 0xbdebd1b8;
          auVar311._28_4_ = 0xbdebd1b8;
          auVar110 = vfmadd213ps_fma(auVar286,auVar181,auVar311);
          auVar312._8_4_ = 0x3def251a;
          auVar312._0_8_ = 0x3def251a3def251a;
          auVar312._12_4_ = 0x3def251a;
          auVar312._16_4_ = 0x3def251a;
          auVar312._20_4_ = 0x3def251a;
          auVar312._24_4_ = 0x3def251a;
          auVar312._28_4_ = 0x3def251a;
          auVar110 = vfmadd213ps_fma(ZEXT1632(auVar110),auVar181,auVar312);
          auVar313._8_4_ = 0xbdfe5d4f;
          auVar313._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar313._12_4_ = 0xbdfe5d4f;
          auVar313._16_4_ = 0xbdfe5d4f;
          auVar313._20_4_ = 0xbdfe5d4f;
          auVar313._24_4_ = 0xbdfe5d4f;
          auVar313._28_4_ = 0xbdfe5d4f;
          auVar110 = vfmadd213ps_fma(ZEXT1632(auVar110),auVar181,auVar313);
          auVar314._8_4_ = 0x3e11e9bf;
          auVar314._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar314._12_4_ = 0x3e11e9bf;
          auVar314._16_4_ = 0x3e11e9bf;
          auVar314._20_4_ = 0x3e11e9bf;
          auVar314._24_4_ = 0x3e11e9bf;
          auVar314._28_4_ = 0x3e11e9bf;
          auVar110 = vfmadd213ps_fma(ZEXT1632(auVar110),auVar181,auVar314);
          auVar315._8_4_ = 0xbe2aae50;
          auVar315._0_8_ = 0xbe2aae50be2aae50;
          auVar315._12_4_ = 0xbe2aae50;
          auVar315._16_4_ = 0xbe2aae50;
          auVar315._20_4_ = 0xbe2aae50;
          auVar315._24_4_ = 0xbe2aae50;
          auVar315._28_4_ = 0xbe2aae50;
          auVar110 = vfmadd213ps_fma(ZEXT1632(auVar110),auVar181,auVar315);
          auVar316._8_4_ = 0x3e4cceac;
          auVar316._0_8_ = 0x3e4cceac3e4cceac;
          auVar316._12_4_ = 0x3e4cceac;
          auVar316._16_4_ = 0x3e4cceac;
          auVar316._20_4_ = 0x3e4cceac;
          auVar316._24_4_ = 0x3e4cceac;
          auVar316._28_4_ = 0x3e4cceac;
          auVar110 = vfmadd213ps_fma(ZEXT1632(auVar110),auVar181,auVar316);
          auVar317._8_4_ = 0xbe7ffffc;
          auVar317._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar317._12_4_ = 0xbe7ffffc;
          auVar317._16_4_ = 0xbe7ffffc;
          auVar317._20_4_ = 0xbe7ffffc;
          auVar317._24_4_ = 0xbe7ffffc;
          auVar317._28_4_ = 0xbe7ffffc;
          auVar110 = vfmadd213ps_fma(ZEXT1632(auVar110),auVar181,auVar317);
          auVar318._8_4_ = 0x3eaaaaaa;
          auVar318._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar318._12_4_ = 0x3eaaaaaa;
          auVar318._16_4_ = 0x3eaaaaaa;
          auVar318._20_4_ = 0x3eaaaaaa;
          auVar318._24_4_ = 0x3eaaaaaa;
          auVar318._28_4_ = 0x3eaaaaaa;
          auVar110 = vfmadd213ps_fma(ZEXT1632(auVar110),auVar181,auVar318);
          auVar287._0_4_ = auVar258._0_4_ * auVar181._0_4_ * auVar110._0_4_;
          auVar287._4_4_ = auVar258._4_4_ * auVar181._4_4_ * auVar110._4_4_;
          auVar287._8_4_ = auVar258._8_4_ * auVar181._8_4_ * auVar110._8_4_;
          auVar287._12_4_ = auVar258._12_4_ * auVar181._12_4_ * auVar110._12_4_;
          auVar287._16_4_ = auVar258._16_4_ * auVar181._16_4_ * 0.0;
          auVar287._20_4_ = auVar258._20_4_ * auVar181._20_4_ * 0.0;
          auVar287._24_4_ = auVar258._24_4_ * auVar181._24_4_ * 0.0;
          auVar287._28_4_ = 0;
          auVar67 = vcvtdq2ps_avx(auVar235);
          auVar110 = vfmadd231ps_fma(auVar287,auVar67,auVar347);
          auVar110 = vfmsub231ps_fma(ZEXT1632(auVar110),auVar274,auVar258);
          auVar98 = vcmpps_avx(ZEXT1632(auVar201),_DAT_005f5320,2);
          auVar96 = vsubps_avx(ZEXT1632(auVar110),auVar181);
          auVar110 = vfmsub231ps_fma(auVar96,auVar365,auVar67);
          auVar288._8_4_ = 0xc0000000;
          auVar288._0_8_ = 0xc0000000c0000000;
          auVar288._12_4_ = 0xc0000000;
          auVar288._16_4_ = 0xc0000000;
          auVar288._20_4_ = 0xc0000000;
          auVar288._24_4_ = 0xc0000000;
          auVar288._28_4_ = 0xc0000000;
          auVar182._0_4_ = auVar110._0_4_ * -2.0;
          auVar182._4_4_ = auVar110._4_4_ * -2.0;
          auVar182._8_4_ = auVar110._8_4_ * -2.0;
          auVar182._12_4_ = auVar110._12_4_ * -2.0;
          auVar182._16_4_ = 0x80000000;
          auVar182._20_4_ = 0x80000000;
          auVar182._24_4_ = 0x80000000;
          auVar182._28_4_ = 0;
          auVar236._8_4_ = 0x7fffffff;
          auVar236._0_8_ = 0x7fffffff7fffffff;
          auVar236._12_4_ = 0x7fffffff;
          auVar236._16_4_ = 0x7fffffff;
          auVar236._20_4_ = 0x7fffffff;
          auVar236._24_4_ = 0x7fffffff;
          auVar236._28_4_ = 0x7fffffff;
          auVar98 = vblendvps_avx(auVar182,auVar236,auVar98);
          auVar183._8_4_ = 0x42b0c0a5;
          auVar183._0_8_ = 0x42b0c0a542b0c0a5;
          auVar183._12_4_ = 0x42b0c0a5;
          auVar183._16_4_ = 0x42b0c0a5;
          auVar183._20_4_ = 0x42b0c0a5;
          auVar183._24_4_ = 0x42b0c0a5;
          auVar183._28_4_ = 0x42b0c0a5;
          auVar98 = vminps_avx(auVar98,auVar183);
          auVar184._8_4_ = 0xc2b0c0a5;
          auVar184._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar184._12_4_ = 0xc2b0c0a5;
          auVar184._16_4_ = 0xc2b0c0a5;
          auVar184._20_4_ = 0xc2b0c0a5;
          auVar184._24_4_ = 0xc2b0c0a5;
          auVar184._28_4_ = 0xc2b0c0a5;
          auVar67 = vmaxps_avx(auVar98,auVar184);
          auVar185._8_4_ = 0x3fb8aa3b;
          auVar185._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar185._12_4_ = 0x3fb8aa3b;
          auVar185._16_4_ = 0x3fb8aa3b;
          auVar185._20_4_ = 0x3fb8aa3b;
          auVar185._24_4_ = 0x3fb8aa3b;
          auVar185._28_4_ = 0x3fb8aa3b;
          auVar110 = vfmadd213ps_fma(auVar185,auVar67,auVar274);
          auVar96 = vroundps_avx(ZEXT1632(auVar110),1);
          auVar98 = vcmpps_avx(ZEXT1632(auVar110),auVar96,1);
          auVar98 = vandps_avx(auVar98,auVar244);
          auVar98 = vsubps_avx(auVar96,auVar98);
          auVar110 = vfmsub231ps_fma(auVar67,auVar98,auVar365);
          auVar164 = vfnmsub231ps_fma(ZEXT1632(auVar110),auVar98,auVar347);
          auVar67 = ZEXT1632(auVar164);
          auVar25._28_4_ = auVar96._28_4_;
          auVar25._0_28_ =
               ZEXT1628(CONCAT412(auVar164._12_4_ * auVar164._12_4_,
                                  CONCAT48(auVar164._8_4_ * auVar164._8_4_,
                                           CONCAT44(auVar164._4_4_ * auVar164._4_4_,
                                                    auVar164._0_4_ * auVar164._0_4_))));
          auVar259._8_4_ = 0x39506967;
          auVar259._0_8_ = 0x3950696739506967;
          auVar259._12_4_ = 0x39506967;
          auVar259._16_4_ = 0x39506967;
          auVar259._20_4_ = 0x39506967;
          auVar259._24_4_ = 0x39506967;
          auVar259._28_4_ = 0x39506967;
          auVar319._8_4_ = 0x3ab743ce;
          auVar319._0_8_ = 0x3ab743ce3ab743ce;
          auVar319._12_4_ = 0x3ab743ce;
          auVar319._16_4_ = 0x3ab743ce;
          auVar319._20_4_ = 0x3ab743ce;
          auVar319._24_4_ = 0x3ab743ce;
          auVar319._28_4_ = 0x3ab743ce;
          auVar110 = vfmadd213ps_fma(auVar259,auVar67,auVar319);
          auVar110 = vfmadd213ps_fma(ZEXT1632(auVar110),auVar67,auVar355);
          auVar110 = vfmadd213ps_fma(ZEXT1632(auVar110),auVar67,auVar245);
          auVar250 = ZEXT3264(auVar244);
          auVar67 = ZEXT1632(auVar164);
          auVar110 = vfmadd213ps_fma(ZEXT1632(auVar110),auVar67,auVar373);
          auVar110 = vfmadd213ps_fma(ZEXT1632(auVar110),auVar67,auVar274);
          auVar201 = vfmadd213ps_fma(ZEXT1632(auVar110),auVar25,auVar67);
          auVar111._0_4_ = (int)auVar98._0_4_;
          auVar111._4_4_ = (int)auVar98._4_4_;
          auVar111._8_4_ = (int)auVar98._8_4_;
          auVar111._12_4_ = (int)auVar98._12_4_;
          auVar142._16_4_ = (int)auVar98._16_4_;
          auVar142._0_16_ = auVar111;
          auVar142._20_4_ = (int)auVar98._20_4_;
          auVar142._24_4_ = (int)auVar98._24_4_;
          auVar142._28_4_ = (int)auVar98._28_4_;
          auVar164 = vpslld_avx(auVar111,0x17);
          auVar110 = vpslld_avx(auVar142._16_16_,0x17);
          auVar110 = vpaddd_avx(auVar110,auVar196);
          auVar164 = vpaddd_avx(auVar164,auVar196);
          auVar143._16_16_ = auVar110;
          auVar143._0_16_ = auVar164;
          auVar186._0_4_ = auVar201._0_4_ + fVar108;
          auVar186._4_4_ = auVar201._4_4_ + fVar71;
          auVar186._8_4_ = auVar201._8_4_ + fVar302;
          auVar186._12_4_ = auVar201._12_4_ + fVar163;
          auVar186._16_4_ = fVar322 + 0.0;
          auVar186._20_4_ = fVar323 + 0.0;
          auVar186._24_4_ = fVar324 + 0.0;
          auVar186._28_4_ = fVar325 + 0.0;
          auVar110 = vfmadd213ps_fma(auVar143,auVar186,auVar244);
          auVar244 = vdivps_avx(auVar244,ZEXT1632(auVar110));
          auVar110 = vfnmadd213ps_fma(auVar244,auVar288,auVar338);
          auVar90 = ZEXT1628(auVar110);
          goto LAB_002fbdfb;
        case 6:
          puVar20 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar7 = *puVar20;
          auVar149._4_4_ = uVar7;
          auVar149._0_4_ = uVar7;
          auVar149._8_4_ = uVar7;
          auVar149._12_4_ = uVar7;
          auVar149._16_4_ = uVar7;
          auVar149._20_4_ = uVar7;
          auVar149._24_4_ = uVar7;
          auVar149._28_4_ = uVar7;
          uVar7 = puVar20[1];
          auVar190._4_4_ = uVar7;
          auVar190._0_4_ = uVar7;
          auVar190._8_4_ = uVar7;
          auVar190._12_4_ = uVar7;
          auVar190._16_4_ = uVar7;
          auVar190._20_4_ = uVar7;
          auVar190._24_4_ = uVar7;
          auVar190._28_4_ = uVar7;
          auVar110 = vfmadd231ps_fma(auVar190,auVar91,auVar149);
          auVar98 = vmaxps_avx(ZEXT1632(auVar110),_DAT_005f5320);
          auVar244 = vminps_avx(auVar98,auVar244);
          auVar90 = auVar244._0_28_;
LAB_002fbdfb:
          auVar91._4_4_ = auVar90._4_4_ * fVar107;
          auVar91._0_4_ = auVar90._0_4_ * fVar72;
          auVar91._8_4_ = auVar90._8_4_ * auVar91._8_4_;
          auVar91._12_4_ = auVar90._12_4_ * auVar91._12_4_;
          auVar91._16_4_ = auVar90._16_4_ * auVar91._16_4_;
          auVar91._20_4_ = auVar90._20_4_ * auVar91._20_4_;
          auVar91._24_4_ = auVar90._24_4_ * auVar91._24_4_;
        }
        *(undefined1 (*) [32])((long)top_blob->data + uVar36 * 0x20) = auVar91;
        uVar36 = uVar36 + 1;
      } while (uVar36 != uVar35);
    }
    iVar30 = 0;
  }
LAB_002fd619:
  piVar18 = (int *)CONCAT44(uStack_12c,uStack_130);
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + -1;
    UNLOCK();
    if (*piVar18 == 0) {
      if (local_118 == (Allocator *)0x0) {
        if (local_138 != (undefined1 (*) [32])0x0) {
          free(local_138);
        }
      }
      else {
        (*local_118->_vptr_Allocator[3])();
      }
    }
  }
  return iVar30;
}

Assistant:

int InnerProduct_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return forward_fp16s(bottom_blob, top_blob, opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
        if (bottom_blob_flattened.empty())
            return -100;
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}